

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::forward
          (DeconvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar9;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  ulong uVar12;
  int *piVar13;
  void *pvVar14;
  size_t sVar15;
  void *pvVar16;
  Layer *pLVar17;
  bool bVar18;
  byte bVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  float afVar35 [16];
  float afVar36 [16];
  float afVar37 [16];
  float afVar38 [16];
  float afVar39 [16];
  float afVar40 [16];
  float afVar41 [16];
  float afVar42 [16];
  float afVar43 [16];
  float afVar44 [16];
  float afVar45 [16];
  float afVar46 [16];
  float afVar47 [16];
  float afVar48 [16];
  float afVar49 [16];
  float afVar50 [16];
  float afVar51 [16];
  Option OVar52;
  undefined1 auVar53 [48];
  undefined8 uVar54;
  Mat *pMVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  _func_int *p_Var65;
  _func_int **pp_Var66;
  Allocator *pAVar67;
  int iVar68;
  uint uVar69;
  ulong uVar70;
  long lVar71;
  float *pfVar72;
  int _h;
  _func_int *p_Var73;
  uint uVar74;
  int iVar75;
  void *pvVar76;
  undefined1 (*pauVar77) [16];
  undefined1 (*pauVar78) [64];
  undefined1 (*pauVar79) [32];
  int iVar80;
  size_t sVar81;
  long lVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  int _w;
  float fVar144;
  undefined1 auVar145 [64];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  float fVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  v4sf one;
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 in_ZMM29 [64];
  undefined1 auVar181 [64];
  Option opt_p;
  Mat m_1;
  Mat m;
  Option opt_g;
  ulong local_2d8;
  ulong local_2c0;
  int local_2b8;
  int local_2a8;
  int local_288;
  Mat local_248;
  void *local_200;
  long local_1f8;
  void *local_1f0;
  undefined1 local_1e8 [24];
  int iStack_1d0;
  Allocator *pAStack_1c8;
  undefined8 uStack_1c0;
  int iStack_1b8;
  int iStack_1b4;
  int iStack_1b0;
  undefined1 auStack_1cc [36];
  size_t local_1a8;
  int local_198;
  int iStack_194;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  Mat local_178;
  undefined1 local_128 [16];
  Mat *local_118;
  long local_110;
  void *local_108;
  int *local_100;
  Allocator *local_f8;
  int local_f0;
  Allocator *local_e8;
  int local_e0;
  int iStack_dc;
  int iStack_d8;
  int iStack_d4;
  int local_d0;
  ulong local_c8;
  void *local_c0;
  int *local_b8;
  ulong local_b0;
  int local_a8;
  Allocator *local_a0;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  ulong local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  undefined1 auVar97 [16];
  undefined1 auVar120 [32];
  
  auVar83 = in_ZMM29._0_16_;
  uVar12 = bottom_blob->elemsize;
  iVar75 = bottom_blob->elempack;
  pvVar76 = (void *)(long)iVar75;
  p_Var65 = this->_vptr_DeconvolutionDepthWise_x86_avx512[-3];
  uVar74 = 1;
  if (opt->use_packing_layout == true) {
    uVar74 = *(uint *)(&this->field_0xd0 + (long)p_Var65);
    if ((uVar74 & 0xf) == 0) {
      uVar74 = 0x10;
    }
    else if ((uVar74 & 7) == 0) {
      uVar74 = 8;
    }
    else {
      uVar74 = (uint)((uVar74 & 3) == 0) * 3 + 1;
    }
  }
  uVar4 = bottom_blob->w;
  uVar9 = bottom_blob->h;
  auVar85._4_4_ = uVar9;
  auVar85._0_4_ = uVar4;
  uVar5 = *(ulong *)(&this->field_0xd4 + (long)p_Var65);
  uVar6 = *(ulong *)(&this->field_0xe4 + (long)p_Var65);
  uVar7 = *(ulong *)(&this->field_0xdc + (long)p_Var65);
  uVar8 = *(ulong *)(&this->field_0xfc + (long)p_Var65);
  uVar69 = bottom_blob->c;
  uVar70 = (ulong)uVar69;
  local_248.cstep = 0;
  auVar84 = (undefined1  [16])0x0;
  local_248.data = (void *)0x0;
  local_248.refcount._0_4_ = 0;
  local_248.refcount._4_4_ = 0;
  local_248.elemsize = 0;
  local_248.elempack = 0;
  local_248.allocator = (Allocator *)0x0;
  local_248.dims = 0;
  local_248.w = 0;
  local_248.h = 0;
  local_248.d = 0;
  local_248.c = 0;
  p_Var73 = this->_vptr_DeconvolutionDepthWise_x86_avx512[-3];
  p_Var65 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_avx512 + (long)p_Var73);
  lVar71 = 0x10;
  uStack_190 = 0;
  if (((((*(int *)(&this->field_0xec + (long)p_Var73) < 1) && (*(int *)(p_Var65 + 0xf0) < 1)) &&
       (*(int *)(p_Var65 + 0xf4) < 1)) && (*(int *)(p_Var65 + 0xf8) < 1)) &&
     ((*(int *)(p_Var65 + 0x104) < 1 || (*(int *)(p_Var65 + 0x108) < 1)))) {
    auVar84 = (undefined1  [16])0x0;
    if (&local_248 != top_blob) {
      piVar13 = top_blob->refcount;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + 1;
        UNLOCK();
      }
      local_248.data = top_blob->data;
      local_248.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_248.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_248.elemsize = top_blob->elemsize;
      local_248.elempack = top_blob->elempack;
      local_248.allocator = top_blob->allocator;
      auVar84._0_4_ = top_blob->dims;
      auVar84._4_4_ = top_blob->w;
      uVar10 = top_blob->h;
      uVar11 = top_blob->d;
      auVar84._8_8_ = CONCAT44(uVar11,uVar10);
      local_248.c = top_blob->c;
      local_248.cstep = top_blob->cstep;
      p_Var73 = this->_vptr_DeconvolutionDepthWise_x86_avx512[-3];
      local_248.dims = auVar84._0_4_;
      local_248.w = auVar84._4_4_;
      local_248._48_8_ = auVar84._8_8_;
    }
    p_Var65 = (_func_int *)((long)&this->_vptr_DeconvolutionDepthWise_x86_avx512 + (long)p_Var73);
    lVar71 = 8;
  }
  auVar85._8_8_ = 0;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar7;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar6;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar8;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar5;
  auVar86 = vpcmpeqd_avx(auVar84,auVar84);
  auVar84 = vpaddd_avx(auVar85,auVar86);
  auVar84 = vpmulld_avx(auVar89,auVar84);
  auVar84 = vpaddd_avx(auVar84,auVar90);
  auVar85 = vpaddd_avx(auVar87,auVar86);
  local_128 = vpmulld_avx(auVar85,auVar88);
  auVar84 = vpaddd_avx(local_128,auVar84);
  local_188 = vpsubd_avx(auVar84,auVar86);
  sVar81 = (uVar12 / (ulong)pvVar76) * (ulong)uVar74;
  _w = local_188._0_4_;
  _h = local_188._4_4_;
  local_198 = uVar4;
  iStack_194 = uVar9;
  Mat::create(&local_248,_w,_h,*(int *)(p_Var65 + 0xd0) / (int)uVar74,sVar81,uVar74,
              *(Allocator **)(&opt->lightmode + lVar71));
  iVar58 = iStack_194;
  iVar62 = local_198;
  afVar51 = _ps512_cephes_log_p8;
  afVar50 = _ps512_cephes_log_p7;
  afVar49 = _ps512_cephes_log_p6;
  afVar48 = _ps512_cephes_log_p5;
  afVar47 = _ps512_cephes_log_p4;
  afVar46 = _ps512_cephes_log_p3;
  afVar45 = _ps512_cephes_log_p2;
  afVar44 = _ps512_cephes_exp_p5;
  afVar43 = _ps512_cephes_exp_p4;
  afVar42 = _ps512_cephes_exp_p3;
  afVar41 = _ps512_cephes_exp_p2;
  afVar40 = _ps512_cephes_exp_p1;
  afVar39 = _ps512_cephes_exp_p0;
  afVar38 = _ps512_cephes_LOG2EF;
  afVar37 = _ps512_exp_lo;
  afVar36 = _ps512_exp_hi;
  afVar35 = _ps512_1;
  iVar57 = -100;
  if ((local_248.data == (void *)0x0) || ((long)local_248.c * local_248.cstep == 0))
  goto LAB_0046224c;
  p_Var65 = this->_vptr_DeconvolutionDepthWise_x86_avx512[-3];
  iVar56 = iVar75 * uVar69;
  iVar57 = *(int *)(&this->field_0x114 + (long)p_Var65);
  local_118 = top_blob;
  if ((iVar56 == iVar57) && (iVar56 == *(int *)(&this->field_0xd0 + (long)p_Var65))) {
    iVar57 = *(int *)(&this->field_0xd8 + (long)p_Var65) *
             *(int *)(&this->field_0xd4 + (long)p_Var65);
    uVar1 = local_128._4_4_;
    if (iVar75 < 8) {
LAB_00460397:
      if (iVar75 == 1) {
        if (0 < (int)uVar69) {
          local_1f0 = local_248.data;
          local_1f8 = local_248.cstep * local_248.elemsize;
          pvVar76 = (this->weight_data_tm).data;
          iVar75 = bottom_blob->w;
          local_200 = bottom_blob->data;
          sVar81 = bottom_blob->elemsize;
          local_110 = bottom_blob->cstep * sVar81;
          uVar12 = vpcmpd_avx512vl((undefined1  [16])0x0,local_188,1);
          local_198 = (int)((long)iVar57 << 2);
          iStack_194 = (int)((ulong)((long)iVar57 << 2) >> 0x20);
          iVar57 = -local_128._0_4_;
          local_2c0 = 0;
          do {
            pvVar14 = local_200;
            if (((uVar12 & 0xf) >> 1 & 1) != 0) {
              lVar71 = local_110 * local_2c0;
              pfVar72 = (float *)(local_1f8 * local_2c0 + (long)local_1f0);
              pp_Var66 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
              iVar56 = 0;
              do {
                if ((uVar12 & 1) != 0) {
                  iVar80 = 0;
                  local_288 = iVar57;
                  do {
                    p_Var65 = pp_Var66[-3];
                    if (*(int *)(&this->field_0x10c + (long)p_Var65) == 0) {
                      auVar145 = ZEXT1664((undefined1  [16])0x0);
                    }
                    else {
                      auVar145 = ZEXT464(*(uint *)(*(long *)(&this->field_0x1b0 + (long)p_Var65) +
                                                  local_2c0 * 4));
                    }
                    auVar83 = auVar145._0_16_;
                    if (0 < *(int *)(&this->field_0xd8 + (long)p_Var65)) {
                      iVar59 = 0;
                      do {
                        iVar60 = *(int *)(&this->field_0xe0 + (long)p_Var65) * iVar59 +
                                 (iVar56 - uVar1);
                        if (((-1 < iVar60) &&
                            (iVar61 = iVar60 / *(int *)(&this->field_0xe8 + (long)p_Var65),
                            iVar60 % *(int *)(&this->field_0xe8 + (long)p_Var65) == 0)) &&
                           (iVar61 < iVar58)) {
                          iVar60 = *(int *)(&this->field_0xd4 + (long)p_Var65);
                          if (0 < (long)iVar60) {
                            lVar82 = 0;
                            iVar68 = local_288;
                            do {
                              if (((-1 < iVar68) &&
                                  (iVar63 = iVar68 / *(int *)(&this->field_0xe4 + (long)p_Var65),
                                  iVar68 % *(int *)(&this->field_0xe4 + (long)p_Var65) == 0)) &&
                                 (iVar63 < iVar62)) {
                                auVar83 = vfmadd231ss_fma(auVar145._0_16_,
                                                          ZEXT416(*(uint *)((long)pvVar76 +
                                                                           lVar82 * 4 +
                                                                           (ulong)(uint)(iVar60 * 
                                                  iVar59) * 4)),
                                                  ZEXT416(*(uint *)((long)pvVar14 +
                                                                   (long)iVar63 * 4 +
                                                                   (long)iVar61 *
                                                                   (long)iVar75 * sVar81 + lVar71)))
                                ;
                                auVar145 = ZEXT1664(auVar83);
                              }
                              lVar82 = lVar82 + 1;
                              iVar68 = iVar68 + *(int *)(&this->field_0xdc + (long)p_Var65);
                            } while (iVar60 != lVar82);
                          }
                        }
                        auVar83 = auVar145._0_16_;
                        iVar59 = iVar59 + 1;
                      } while (iVar59 != *(int *)(&this->field_0xd8 + (long)p_Var65));
                    }
                    fVar151 = auVar83._0_4_;
                    fVar144 = fVar151;
                    switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var65)) {
                    case 1:
                      auVar83 = vmaxss_avx(auVar83,ZEXT416(0));
                      fVar144 = auVar83._0_4_;
                      break;
                    case 2:
                      uVar20 = vcmpss_avx512f(auVar83,ZEXT416(0),0xe);
                      bVar18 = (bool)((byte)uVar20 & 1);
                      fVar144 = (float)((uint)bVar18 * 0x3f800000 +
                                       (uint)!bVar18 *
                                       **(int **)(&this->field_0x120 + (long)p_Var65)) * fVar151;
                      break;
                    case 3:
                      fVar151 = (float)(*(uint **)(&this->field_0x120 + (long)p_Var65))[1];
                      auVar83 = vmaxss_avx(auVar83,ZEXT416(**(uint **)(&this->field_0x120 +
                                                                      (long)p_Var65)));
                      fVar144 = auVar83._0_4_;
                      if (fVar151 < auVar83._0_4_) {
                        fVar144 = fVar151;
                      }
                      break;
                    case 4:
                      auVar83 = vminss_avx(auVar83,SUB6416(ZEXT464(0x42b0c0a5),0));
                      auVar91._8_4_ = 0x80000000;
                      auVar91._0_8_ = 0x8000000080000000;
                      auVar91._12_4_ = 0x80000000;
                      auVar84 = vxorps_avx512vl(auVar83,auVar91);
                      uVar20 = vcmpss_avx512f(auVar83,ZEXT416(0xc2b0c0a5),1);
                      bVar18 = (bool)((byte)uVar20 & 1);
                      fVar144 = expf((float)((uint)bVar18 * 0x42b0c0a5 +
                                            (uint)!bVar18 * auVar84._0_4_));
                      fVar144 = 1.0 / (fVar144 + 1.0);
                      break;
                    case 5:
                      fVar144 = expf(fVar151);
                      fVar144 = logf(fVar144 + 1.0);
                      fVar144 = tanhf(fVar144);
                      fVar144 = fVar144 * fVar151;
                      break;
                    case 6:
                      fVar2 = **(float **)(&this->field_0x120 + (long)p_Var65);
                      auVar86._8_4_ = 0x80000000;
                      auVar86._0_8_ = 0x8000000080000000;
                      auVar86._12_4_ = 0x80000000;
                      auVar85 = ZEXT416((uint)(*(float **)(&this->field_0x120 + (long)p_Var65))[1]);
                      auVar84 = vxorps_avx512vl(auVar85,auVar86);
                      fVar148 = auVar84._0_4_ / fVar2;
                      fVar144 = 0.0;
                      if ((fVar148 <= fVar151) &&
                         (fVar144 = fVar151, fVar151 <= fVar148 + 1.0 / fVar2)) {
                        auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar83,auVar85);
                        fVar144 = auVar83._0_4_ * fVar151;
                      }
                    }
                    *pfVar72 = fVar144;
                    pfVar72 = pfVar72 + 1;
                    iVar80 = iVar80 + 1;
                    local_288 = local_288 + 1;
                  } while (iVar80 != _w);
                }
                iVar56 = iVar56 + 1;
              } while (iVar56 != _h);
            }
            local_2c0 = local_2c0 + 1;
            pvVar76 = (void *)((long)pvVar76 + CONCAT44(iStack_194,local_198));
          } while (local_2c0 != uVar70);
        }
      }
      else if ((iVar75 == 4) && (0 < (int)uVar69)) {
        local_1f8 = CONCAT44(local_1f8._4_4_,iVar57 * 4);
        uVar12 = vpcmpd_avx512vl((undefined1  [16])0x0,local_188,1);
        uVar5 = (uVar12 & 0xf) >> 1;
        local_1f0 = (void *)CONCAT44(local_1f0._4_4_,(int)uVar5);
        local_2d8 = 0;
        auVar146._8_4_ = 0x42b0c0a5;
        auVar146._0_8_ = 0x42b0c0a542b0c0a5;
        auVar146._12_4_ = 0x42b0c0a5;
        auVar149._8_4_ = 0xc2b0c0a5;
        auVar149._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar149._12_4_ = 0xc2b0c0a5;
        auVar152._8_4_ = 0x3f000000;
        auVar152._0_8_ = 0x3f0000003f000000;
        auVar152._12_4_ = 0x3f000000;
        auVar154._8_4_ = 0x3fb8aa3b;
        auVar154._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar154._12_4_ = 0x3fb8aa3b;
        auVar156._8_4_ = 0x3f800000;
        auVar156._0_8_ = 0x3f8000003f800000;
        auVar156._12_4_ = 0x3f800000;
        auVar158._8_4_ = 0x3f318000;
        auVar158._0_8_ = 0x3f3180003f318000;
        auVar158._12_4_ = 0x3f318000;
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar169._8_4_ = 0x3ab743ce;
        auVar169._0_8_ = 0x3ab743ce3ab743ce;
        auVar169._12_4_ = 0x3ab743ce;
        auVar171._8_4_ = 0x3c088908;
        auVar171._0_8_ = 0x3c0889083c088908;
        auVar171._12_4_ = 0x3c088908;
        auVar173._8_4_ = 0x3d2aa9c1;
        auVar173._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar173._12_4_ = 0x3d2aa9c1;
        auVar175._8_4_ = 0x3e2aaaaa;
        auVar175._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar175._12_4_ = 0x3e2aaaaa;
        auVar177._8_4_ = 0x3f800000;
        auVar177._0_8_ = 0x3f8000003f800000;
        auVar177._12_4_ = 0x3f800000;
        auVar179._8_4_ = 0xb95e8083;
        auVar179._0_8_ = 0xb95e8083b95e8083;
        auVar179._12_4_ = 0xb95e8083;
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar95 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        do {
          if ((uVar5 & 1) != 0) {
            pvVar14 = (this->weight_data_tm).data;
            sVar81 = bottom_blob->cstep;
            sVar15 = bottom_blob->elemsize;
            pvVar16 = bottom_blob->data;
            iVar75 = bottom_blob->w;
            pauVar77 = (undefined1 (*) [16])
                       (local_248.cstep * local_2d8 * local_248.elemsize + (long)local_248.data);
            pp_Var66 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
            iVar62 = 0;
            do {
              if ((uVar12 & 1) != 0) {
                iVar58 = 0;
                local_2b8 = -local_128._0_4_;
                do {
                  p_Var65 = pp_Var66[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var65) == 0) {
                    auVar145 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar145 = ZEXT1664(*(undefined1 (*) [16])
                                         (*(long *)(&this->field_0x1b0 + (long)p_Var65) +
                                         local_2d8 * 0x10));
                  }
                  auVar103 = auVar145._0_16_;
                  if (0 < *(int *)(&this->field_0xd8 + (long)p_Var65)) {
                    iVar80 = 0;
                    iVar56 = 0;
                    do {
                      iVar59 = *(int *)(&this->field_0xe0 + (long)p_Var65) * iVar56 +
                               (iVar62 - local_128._4_4_);
                      if (((-1 < iVar59) &&
                          (iVar60 = iVar59 / *(int *)(&this->field_0xe8 + (long)p_Var65),
                          iVar59 % *(int *)(&this->field_0xe8 + (long)p_Var65) == 0)) &&
                         (iVar60 < iStack_194)) {
                        lVar71 = (long)*(int *)(&this->field_0xd4 + (long)p_Var65);
                        if (0 < lVar71) {
                          uVar74 = *(int *)(&this->field_0xd4 + (long)p_Var65) * iVar80;
                          iVar59 = local_2b8;
                          do {
                            if (((-1 < iVar59) &&
                                (iVar61 = iVar59 / *(int *)(&this->field_0xe4 + (long)p_Var65),
                                iVar59 % *(int *)(&this->field_0xe4 + (long)p_Var65) == 0)) &&
                               (iVar61 < local_198)) {
                              auVar103 = vfmadd231ps_fma(auVar145._0_16_,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar16 +
                                                          (long)(iVar61 << 2) * 4 +
                                                          (long)iVar60 * (long)iVar75 * sVar15 +
                                                          sVar81 * local_2d8 * sVar15),
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar14 +
                                                          (ulong)uVar74 * 4 +
                                                          (long)(iVar57 * 4 * (int)local_2d8) * 4));
                              auVar145 = ZEXT1664(auVar103);
                            }
                            uVar74 = uVar74 + 4;
                            iVar59 = iVar59 + *(int *)(&this->field_0xdc + (long)p_Var65);
                            lVar71 = lVar71 + -1;
                          } while (lVar71 != 0);
                        }
                      }
                      auVar103 = auVar145._0_16_;
                      iVar56 = iVar56 + 1;
                      iVar80 = iVar80 + 4;
                    } while (iVar56 != *(int *)(&this->field_0xd8 + (long)p_Var65));
                  }
                  switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var65)) {
                  case 1:
                    auVar103 = vmaxps_avx(auVar103,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar105 = vmaxps_avx(auVar103,(undefined1  [16])0x0);
                    auVar103 = vminps_avx(auVar103,(undefined1  [16])0x0);
                    uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var65);
                    auVar26._4_4_ = uVar1;
                    auVar26._0_4_ = uVar1;
                    auVar26._8_4_ = uVar1;
                    auVar26._12_4_ = uVar1;
                    auVar103 = vfmadd132ps_avx512vl(auVar103,auVar105,auVar26);
                    break;
                  case 3:
                    uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var65);
                    auVar24._4_4_ = uVar1;
                    auVar24._0_4_ = uVar1;
                    auVar24._8_4_ = uVar1;
                    auVar24._12_4_ = uVar1;
                    auVar103 = vmaxps_avx512vl(auVar103,auVar24);
                    uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var65))[1];
                    auVar25._4_4_ = uVar1;
                    auVar25._0_4_ = uVar1;
                    auVar25._8_4_ = uVar1;
                    auVar25._12_4_ = uVar1;
                    auVar103 = vminps_avx512vl(auVar103,auVar25);
                    break;
                  case 4:
                    auVar23._8_4_ = 0x80000000;
                    auVar23._0_8_ = 0x8000000080000000;
                    auVar23._12_4_ = 0x80000000;
                    auVar103 = vxorps_avx512vl(auVar103,auVar23);
                    auVar103 = vminps_avx(auVar103,auVar146);
                    auVar103 = vmaxps_avx(auVar103,auVar149);
                    auVar105 = vfmadd231ps_fma(auVar152,auVar103,auVar154);
                    auVar97 = vcvttps2dq_avx512vl(auVar105);
                    auVar97 = vcvtdq2ps_avx512vl(auVar97);
                    uVar6 = vcmpps_avx512vl(auVar105,auVar97,1);
                    auVar105 = vsubps_avx512vl(auVar97,auVar156);
                    bVar18 = (bool)((byte)uVar6 & 1);
                    auVar104._0_4_ = (uint)bVar18 * auVar105._0_4_ | (uint)!bVar18 * auVar97._0_4_;
                    bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                    auVar104._4_4_ = (uint)bVar18 * auVar105._4_4_ | (uint)!bVar18 * auVar97._4_4_;
                    bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                    auVar104._8_4_ = (uint)bVar18 * auVar105._8_4_ | (uint)!bVar18 * auVar97._8_4_;
                    bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                    auVar104._12_4_ =
                         (uint)bVar18 * auVar105._12_4_ | (uint)!bVar18 * auVar97._12_4_;
                    auVar105 = vfmsub231ps_avx512vl(auVar103,auVar104,auVar158);
                    auVar103._8_4_ = 0x395e8083;
                    auVar103._0_8_ = 0x395e8083395e8083;
                    auVar103._12_4_ = 0x395e8083;
                    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar104,auVar103);
                    auVar160._0_4_ = auVar105._0_4_ * auVar105._0_4_;
                    auVar160._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                    auVar160._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                    auVar160._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                    auVar103 = vfmadd213ps_fma(auVar83,auVar105,auVar169);
                    auVar103 = vfmadd213ps_fma(auVar103,auVar105,auVar171);
                    auVar103 = vfmadd213ps_fma(auVar103,auVar105,auVar173);
                    auVar103 = vfmadd213ps_fma(auVar103,auVar105,auVar175);
                    auVar103 = vfmadd213ps_fma(auVar103,auVar105,auVar152);
                    auVar103 = vfmadd213ps_fma(auVar103,auVar160,auVar105);
                    auVar161._0_4_ = auVar103._0_4_ + 1.0;
                    auVar161._4_4_ = auVar103._4_4_ + 1.0;
                    auVar161._8_4_ = auVar103._8_4_ + 1.0;
                    auVar161._12_4_ = auVar103._12_4_ + 1.0;
                    auVar103 = vcvttps2dq_avx512vl(auVar104);
                    auVar103 = vpslld_avx(auVar103,0x17);
                    auVar103 = vpaddd_avx(auVar177,auVar103);
                    auVar105 = vfmadd213ps_fma(auVar103,auVar161,auVar156);
                    auVar103 = vrcpps_avx(auVar105);
                    auVar105 = vfmsub213ps_fma(auVar105,auVar103,auVar156);
                    auVar103 = vfnmadd132ps_fma(auVar105,auVar103,auVar103);
                    break;
                  case 5:
                    auVar105 = vminps_avx(auVar103,auVar146);
                    auVar105 = vmaxps_avx(auVar105,auVar149);
                    auVar97 = vfmadd213ps_fma(auVar154,auVar105,auVar152);
                    auVar96 = vcvttps2dq_avx512vl(auVar97);
                    auVar96 = vcvtdq2ps_avx512vl(auVar96);
                    uVar6 = vcmpps_avx512vl(auVar97,auVar96,1);
                    auVar97 = vsubps_avx512vl(auVar96,auVar156);
                    bVar18 = (bool)((byte)uVar6 & 1);
                    auVar98._0_4_ = (uint)bVar18 * auVar97._0_4_ | (uint)!bVar18 * auVar96._0_4_;
                    bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                    auVar98._4_4_ = (uint)bVar18 * auVar97._4_4_ | (uint)!bVar18 * auVar96._4_4_;
                    bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                    auVar98._8_4_ = (uint)bVar18 * auVar97._8_4_ | (uint)!bVar18 * auVar96._8_4_;
                    bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                    auVar98._12_4_ = (uint)bVar18 * auVar97._12_4_ | (uint)!bVar18 * auVar96._12_4_;
                    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar98,auVar158);
                    auVar105 = vfnmsub231ps_avx512vl(auVar105,auVar98,auVar179);
                    auVar164._0_4_ = auVar105._0_4_ * auVar105._0_4_;
                    auVar164._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                    auVar164._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                    auVar164._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                    auVar97 = vfmadd213ps_avx512vl(auVar83,auVar105,auVar169);
                    auVar97 = vfmadd213ps_avx512vl(auVar97,auVar105,auVar171);
                    auVar97 = vfmadd213ps_avx512vl(auVar97,auVar105,auVar173);
                    auVar97 = vfmadd213ps_avx512vl(auVar97,auVar105,auVar175);
                    auVar97 = vfmadd213ps_avx512vl(auVar97,auVar105,auVar152);
                    auVar105 = vfmadd213ps_avx512vl(auVar97,auVar164,auVar105);
                    auVar97 = vaddps_avx512vl(auVar105,auVar156);
                    auVar105 = vcvttps2dq_avx512vl(auVar98);
                    auVar105 = vpslld_avx(auVar105,0x17);
                    auVar105 = vpaddd_avx(auVar105,auVar177);
                    auVar105 = vfmadd213ps_fma(auVar105,auVar97,auVar156);
                    uVar6 = vcmpps_avx512vl(auVar105,(undefined1  [16])0x0,2);
                    auVar165._8_4_ = 0x800000;
                    auVar165._0_8_ = 0x80000000800000;
                    auVar165._12_4_ = 0x800000;
                    auVar105 = vmaxps_avx512vl(auVar105,auVar165);
                    auVar165 = vpsrld_avx(auVar105,0x17);
                    auVar97 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                    auVar21._8_4_ = 0x3f000000;
                    auVar21._0_8_ = 0x3f0000003f000000;
                    auVar21._12_4_ = 0x3f000000;
                    auVar105 = vpternlogd_avx512vl(auVar105,auVar97,auVar21,0xea);
                    uVar7 = vcmpps_avx512vl(auVar105,auVar84,1);
                    auVar97 = vaddps_avx512vl(auVar105,auVar85);
                    auVar105 = vaddps_avx512vl(auVar97,auVar105);
                    bVar18 = (bool)((byte)uVar7 & 1);
                    auVar99._0_4_ = (uint)bVar18 * auVar105._0_4_ | (uint)!bVar18 * auVar97._0_4_;
                    bVar18 = (bool)((byte)(uVar7 >> 1) & 1);
                    auVar99._4_4_ = (uint)bVar18 * auVar105._4_4_ | (uint)!bVar18 * auVar97._4_4_;
                    bVar18 = (bool)((byte)(uVar7 >> 2) & 1);
                    auVar99._8_4_ = (uint)bVar18 * auVar105._8_4_ | (uint)!bVar18 * auVar97._8_4_;
                    bVar18 = (bool)((byte)(uVar7 >> 3) & 1);
                    auVar99._12_4_ = (uint)bVar18 * auVar105._12_4_ | (uint)!bVar18 * auVar97._12_4_
                    ;
                    auVar97 = vmulps_avx512vl(auVar99,auVar99);
                    auVar105 = vfmadd213ps_avx512vl(auVar86,auVar99,auVar87);
                    auVar105 = vfmadd213ps_avx512vl(auVar105,auVar99,auVar88);
                    auVar105 = vfmadd213ps_avx512vl(auVar105,auVar99,auVar89);
                    auVar105 = vfmadd213ps_avx512vl(auVar105,auVar99,auVar90);
                    auVar105 = vfmadd213ps_avx512vl(auVar105,auVar99,auVar91);
                    auVar105 = vfmadd213ps_avx512vl(auVar105,auVar99,auVar92);
                    auVar105 = vfmadd213ps_avx512vl(auVar105,auVar99,auVar93);
                    auVar105 = vfmadd213ps_avx512vl(auVar105,auVar99,auVar94);
                    auVar96 = vmulps_avx512vl(auVar97,auVar99);
                    auVar96 = vmulps_avx512vl(auVar96,auVar105);
                    auVar22._8_4_ = 0xffffff82;
                    auVar22._0_8_ = 0xffffff82ffffff82;
                    auVar22._12_4_ = 0xffffff82;
                    auVar105 = vpaddd_avx512vl(auVar165,auVar22);
                    auVar105 = vcvtdq2ps_avx(auVar105);
                    auVar165 = vsubps_avx512vl(auVar105,auVar156);
                    bVar18 = (bool)((byte)uVar7 & 1);
                    auVar100._0_4_ = (uint)bVar18 * auVar165._0_4_ | (uint)!bVar18 * auVar105._0_4_;
                    bVar18 = (bool)((byte)(uVar7 >> 1) & 1);
                    auVar100._4_4_ = (uint)bVar18 * auVar165._4_4_ | (uint)!bVar18 * auVar105._4_4_;
                    bVar18 = (bool)((byte)(uVar7 >> 2) & 1);
                    auVar100._8_4_ = (uint)bVar18 * auVar165._8_4_ | (uint)!bVar18 * auVar105._8_4_;
                    bVar18 = (bool)((byte)(uVar7 >> 3) & 1);
                    auVar100._12_4_ =
                         (uint)bVar18 * auVar165._12_4_ | (uint)!bVar18 * auVar105._12_4_;
                    auVar105 = vfmadd231ps_avx512vl(auVar96,auVar100,auVar179);
                    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar152,auVar97);
                    auVar105 = vsubps_avx512vl(auVar105,auVar99);
                    auVar105 = vfnmadd231ps_fma(auVar105,auVar158,auVar100);
                    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    bVar18 = (bool)((byte)uVar6 & 1);
                    auVar101._0_4_ =
                         (uint)bVar18 * auVar97._0_4_ |
                         (uint)!bVar18 * (int)(auVar105._0_4_ + auVar105._0_4_);
                    bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                    auVar101._4_4_ =
                         (uint)bVar18 * auVar97._4_4_ |
                         (uint)!bVar18 * (int)(auVar105._4_4_ + auVar105._4_4_);
                    bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                    auVar101._8_4_ =
                         (uint)bVar18 * auVar97._8_4_ |
                         (uint)!bVar18 * (int)(auVar105._8_4_ + auVar105._8_4_);
                    bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                    auVar101._12_4_ =
                         (uint)bVar18 * auVar97._12_4_ |
                         (uint)!bVar18 * (int)(auVar105._12_4_ + auVar105._12_4_);
                    auVar105 = vminps_avx(auVar101,auVar146);
                    auVar105 = vmaxps_avx(auVar105,auVar149);
                    auVar97 = vfmadd213ps_fma(auVar154,auVar105,auVar152);
                    auVar96 = vcvttps2dq_avx512vl(auVar97);
                    auVar96 = vcvtdq2ps_avx512vl(auVar96);
                    uVar6 = vcmpps_avx512vl(auVar97,auVar96,1);
                    auVar97 = vsubps_avx512vl(auVar96,auVar156);
                    bVar18 = (bool)((byte)uVar6 & 1);
                    auVar102._0_4_ = (uint)bVar18 * auVar97._0_4_ | (uint)!bVar18 * auVar96._0_4_;
                    bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                    auVar102._4_4_ = (uint)bVar18 * auVar97._4_4_ | (uint)!bVar18 * auVar96._4_4_;
                    bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                    auVar102._8_4_ = (uint)bVar18 * auVar97._8_4_ | (uint)!bVar18 * auVar96._8_4_;
                    bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                    auVar102._12_4_ = (uint)bVar18 * auVar97._12_4_ | (uint)!bVar18 * auVar96._12_4_
                    ;
                    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar102,auVar158);
                    auVar105 = vfnmsub231ps_avx512vl(auVar105,auVar102,auVar179);
                    auVar166._0_4_ = auVar105._0_4_ * auVar105._0_4_;
                    auVar166._4_4_ = auVar105._4_4_ * auVar105._4_4_;
                    auVar166._8_4_ = auVar105._8_4_ * auVar105._8_4_;
                    auVar166._12_4_ = auVar105._12_4_ * auVar105._12_4_;
                    auVar97 = vfmadd213ps_avx512vl(auVar83,auVar105,auVar169);
                    auVar97 = vfmadd213ps_avx512vl(auVar97,auVar105,auVar171);
                    auVar97 = vfmadd213ps_avx512vl(auVar97,auVar105,auVar173);
                    auVar97 = vfmadd213ps_avx512vl(auVar97,auVar105,auVar175);
                    auVar97 = vfmadd213ps_avx512vl(auVar97,auVar105,auVar152);
                    auVar105 = vfmadd213ps_avx512vl(auVar97,auVar166,auVar105);
                    auVar97 = vaddps_avx512vl(auVar105,auVar156);
                    auVar105 = vcvttps2dq_avx512vl(auVar102);
                    auVar105 = vpslld_avx(auVar105,0x17);
                    auVar105 = vpaddd_avx(auVar105,auVar177);
                    auVar97 = vfmadd213ps_fma(auVar105,auVar97,auVar156);
                    auVar105 = vrcpps_avx(auVar97);
                    auVar96 = vaddps_avx512vl(auVar105,auVar105);
                    auVar97 = vfmsub213ps_avx512vl(auVar97,auVar96,auVar95);
                    auVar105 = vfnmadd213ps_avx512vl(auVar97,auVar105,auVar96);
                    auVar103 = vfmsub231ps_fma(auVar103,auVar103,auVar105);
                    break;
                  case 6:
                    uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var65);
                    auVar96._4_4_ = uVar1;
                    auVar96._0_4_ = uVar1;
                    auVar96._8_4_ = uVar1;
                    auVar96._12_4_ = uVar1;
                    uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var65))[1];
                    auVar105._4_4_ = uVar1;
                    auVar105._0_4_ = uVar1;
                    auVar105._8_4_ = uVar1;
                    auVar105._12_4_ = uVar1;
                    auVar105 = vfmadd213ps_avx512vl(auVar96,auVar103,auVar105);
                    auVar105 = vmaxps_avx(auVar105,(undefined1  [16])0x0);
                    auVar105 = vminps_avx(auVar105,auVar156);
                    auVar97._0_4_ = auVar105._0_4_ * auVar103._0_4_;
                    auVar97._4_4_ = auVar105._4_4_ * auVar103._4_4_;
                    auVar97._8_4_ = auVar105._8_4_ * auVar103._8_4_;
                    auVar97._12_4_ = auVar105._12_4_ * auVar103._12_4_;
                    auVar103 = auVar97;
                  }
                  *pauVar77 = auVar103;
                  pauVar77 = pauVar77 + 1;
                  iVar58 = iVar58 + 1;
                  local_2b8 = local_2b8 + 1;
                } while (iVar58 != _w);
              }
              iVar62 = iVar62 + 1;
            } while (iVar62 != _h);
          }
          local_2d8 = local_2d8 + 1;
          local_200 = pvVar76;
        } while (local_2d8 != uVar70);
      }
    }
    else if (iVar75 == 8) {
      if (0 < (int)uVar69) {
        local_1f8 = CONCAT44(local_1f8._4_4_,iVar57 * 8);
        uVar12 = vpcmpd_avx512vl((undefined1  [16])0x0,local_188,1);
        uVar5 = (uVar12 & 0xf) >> 1;
        local_1f0 = (void *)CONCAT44(local_1f0._4_4_,(int)uVar5);
        local_2d8 = 0;
        auVar147._8_4_ = 0x42b0c0a5;
        auVar147._0_8_ = 0x42b0c0a542b0c0a5;
        auVar147._12_4_ = 0x42b0c0a5;
        auVar147._16_4_ = 0x42b0c0a5;
        auVar147._20_4_ = 0x42b0c0a5;
        auVar147._24_4_ = 0x42b0c0a5;
        auVar147._28_4_ = 0x42b0c0a5;
        auVar150._8_4_ = 0xc2b0c0a5;
        auVar150._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar150._12_4_ = 0xc2b0c0a5;
        auVar150._16_4_ = 0xc2b0c0a5;
        auVar150._20_4_ = 0xc2b0c0a5;
        auVar150._24_4_ = 0xc2b0c0a5;
        auVar150._28_4_ = 0xc2b0c0a5;
        auVar153._8_4_ = 0x3f000000;
        auVar153._0_8_ = 0x3f0000003f000000;
        auVar153._12_4_ = 0x3f000000;
        auVar153._16_4_ = 0x3f000000;
        auVar153._20_4_ = 0x3f000000;
        auVar153._24_4_ = 0x3f000000;
        auVar153._28_4_ = 0x3f000000;
        auVar155._8_4_ = 0x3fb8aa3b;
        auVar155._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar155._12_4_ = 0x3fb8aa3b;
        auVar155._16_4_ = 0x3fb8aa3b;
        auVar155._20_4_ = 0x3fb8aa3b;
        auVar155._24_4_ = 0x3fb8aa3b;
        auVar155._28_4_ = 0x3fb8aa3b;
        auVar157._8_4_ = 0x3f800000;
        auVar157._0_8_ = 0x3f8000003f800000;
        auVar157._12_4_ = 0x3f800000;
        auVar157._16_4_ = 0x3f800000;
        auVar157._20_4_ = 0x3f800000;
        auVar157._24_4_ = 0x3f800000;
        auVar157._28_4_ = 0x3f800000;
        auVar159._8_4_ = 0x3f318000;
        auVar159._0_8_ = 0x3f3180003f318000;
        auVar159._12_4_ = 0x3f318000;
        auVar159._16_4_ = 0x3f318000;
        auVar159._20_4_ = 0x3f318000;
        auVar159._24_4_ = 0x3f318000;
        auVar159._28_4_ = 0x3f318000;
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar170._8_4_ = 0x3ab743ce;
        auVar170._0_8_ = 0x3ab743ce3ab743ce;
        auVar170._12_4_ = 0x3ab743ce;
        auVar170._16_4_ = 0x3ab743ce;
        auVar170._20_4_ = 0x3ab743ce;
        auVar170._24_4_ = 0x3ab743ce;
        auVar170._28_4_ = 0x3ab743ce;
        auVar172._8_4_ = 0x3c088908;
        auVar172._0_8_ = 0x3c0889083c088908;
        auVar172._12_4_ = 0x3c088908;
        auVar172._16_4_ = 0x3c088908;
        auVar172._20_4_ = 0x3c088908;
        auVar172._24_4_ = 0x3c088908;
        auVar172._28_4_ = 0x3c088908;
        auVar174._8_4_ = 0x3d2aa9c1;
        auVar174._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar174._12_4_ = 0x3d2aa9c1;
        auVar174._16_4_ = 0x3d2aa9c1;
        auVar174._20_4_ = 0x3d2aa9c1;
        auVar174._24_4_ = 0x3d2aa9c1;
        auVar174._28_4_ = 0x3d2aa9c1;
        auVar176._8_4_ = 0x3e2aaaaa;
        auVar176._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar176._12_4_ = 0x3e2aaaaa;
        auVar176._16_4_ = 0x3e2aaaaa;
        auVar176._20_4_ = 0x3e2aaaaa;
        auVar176._24_4_ = 0x3e2aaaaa;
        auVar176._28_4_ = 0x3e2aaaaa;
        auVar178._8_4_ = 0x3f800000;
        auVar178._0_8_ = 0x3f8000003f800000;
        auVar178._12_4_ = 0x3f800000;
        auVar178._16_4_ = 0x3f800000;
        auVar178._20_4_ = 0x3f800000;
        auVar178._24_4_ = 0x3f800000;
        auVar178._28_4_ = 0x3f800000;
        auVar180._8_4_ = 0xb95e8083;
        auVar180._0_8_ = 0xb95e8083b95e8083;
        auVar180._12_4_ = 0xb95e8083;
        auVar180._16_4_ = 0xb95e8083;
        auVar180._20_4_ = 0xb95e8083;
        auVar180._24_4_ = 0xb95e8083;
        auVar180._28_4_ = 0xb95e8083;
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar110 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar117 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar118 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          if ((uVar5 & 1) != 0) {
            pvVar14 = (this->weight_data_tm).data;
            sVar81 = bottom_blob->cstep;
            sVar15 = bottom_blob->elemsize;
            pvVar16 = bottom_blob->data;
            iVar56 = bottom_blob->w;
            pauVar79 = (undefined1 (*) [32])
                       (local_248.cstep * local_2d8 * local_248.elemsize + (long)local_248.data);
            pp_Var66 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
            iVar80 = 0;
            do {
              if ((uVar12 & 1) != 0) {
                iVar59 = 0;
                local_2b8 = -local_128._0_4_;
                do {
                  p_Var65 = pp_Var66[-3];
                  if (*(int *)(&this->field_0x10c + (long)p_Var65) == 0) {
                    auVar145 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar145 = ZEXT3264(*(undefined1 (*) [32])
                                         (*(long *)(&this->field_0x1b0 + (long)p_Var65) +
                                         local_2d8 * 0x20));
                  }
                  if (0 < *(int *)(&this->field_0xd8 + (long)p_Var65)) {
                    iVar60 = 0;
                    iVar61 = 0;
                    do {
                      iVar68 = *(int *)(&this->field_0xe0 + (long)p_Var65) * iVar61 +
                               (iVar80 - local_128._4_4_);
                      if (((-1 < iVar68) &&
                          (iVar63 = iVar68 / *(int *)(&this->field_0xe8 + (long)p_Var65),
                          iVar68 % *(int *)(&this->field_0xe8 + (long)p_Var65) == 0)) &&
                         (iVar63 < iStack_194)) {
                        lVar71 = (long)*(int *)(&this->field_0xd4 + (long)p_Var65);
                        if (0 < lVar71) {
                          uVar74 = *(int *)(&this->field_0xd4 + (long)p_Var65) * iVar60;
                          iVar68 = local_2b8;
                          do {
                            if (((-1 < iVar68) &&
                                (iVar64 = iVar68 / *(int *)(&this->field_0xe4 + (long)p_Var65),
                                iVar68 % *(int *)(&this->field_0xe4 + (long)p_Var65) == 0)) &&
                               (iVar64 < local_198)) {
                              auVar83 = vfmadd231ps_fma(auVar145._0_32_,
                                                        *(undefined1 (*) [32])
                                                         ((long)pvVar16 +
                                                         (long)(iVar64 << 3) * 4 +
                                                         (long)iVar63 * (long)iVar56 * sVar15 +
                                                         sVar81 * local_2d8 * sVar15),
                                                        *(undefined1 (*) [32])
                                                         ((long)pvVar14 +
                                                         (ulong)uVar74 * 4 +
                                                         (long)(iVar57 * 8 * (int)local_2d8) * 4));
                              auVar145 = ZEXT1664(auVar83);
                            }
                            uVar74 = uVar74 + 8;
                            iVar68 = iVar68 + *(int *)(&this->field_0xdc + (long)p_Var65);
                            lVar71 = lVar71 + -1;
                          } while (lVar71 != 0);
                        }
                      }
                      iVar61 = iVar61 + 1;
                      iVar60 = iVar60 + 8;
                    } while (iVar61 != *(int *)(&this->field_0xd8 + (long)p_Var65));
                  }
                  auVar128 = auVar145._0_32_;
                  if (*(int *)(&this->field_0x118 + (long)p_Var65) - 1U < 6) {
                    auVar122 = ZEXT1632((undefined1  [16])0x0);
                    auVar129._28_36_ = auVar145._28_36_;
                    switch(*(int *)(&this->field_0x118 + (long)p_Var65)) {
                    case 1:
                      auVar128 = vmaxps_avx(auVar128,ZEXT1632((undefined1  [16])0x0));
                      break;
                    case 2:
                      auVar119 = vmaxps_avx(auVar128,auVar122);
                      auVar128 = vminps_avx(auVar128,auVar122);
                      uVar3 = **(undefined4 **)(&this->field_0x120 + (long)p_Var65);
                      auVar32._4_4_ = uVar3;
                      auVar32._0_4_ = uVar3;
                      auVar32._8_4_ = uVar3;
                      auVar32._12_4_ = uVar3;
                      auVar32._16_4_ = uVar3;
                      auVar32._20_4_ = uVar3;
                      auVar32._24_4_ = uVar3;
                      auVar32._28_4_ = uVar3;
                      auVar128 = vfmadd132ps_avx512vl(auVar128,auVar119,auVar32);
                      break;
                    case 3:
                      uVar3 = **(undefined4 **)(&this->field_0x120 + (long)p_Var65);
                      auVar30._4_4_ = uVar3;
                      auVar30._0_4_ = uVar3;
                      auVar30._8_4_ = uVar3;
                      auVar30._12_4_ = uVar3;
                      auVar30._16_4_ = uVar3;
                      auVar30._20_4_ = uVar3;
                      auVar30._24_4_ = uVar3;
                      auVar30._28_4_ = uVar3;
                      auVar128 = vmaxps_avx512vl(auVar128,auVar30);
                      uVar3 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var65))[1];
                      auVar31._4_4_ = uVar3;
                      auVar31._0_4_ = uVar3;
                      auVar31._8_4_ = uVar3;
                      auVar31._12_4_ = uVar3;
                      auVar31._16_4_ = uVar3;
                      auVar31._20_4_ = uVar3;
                      auVar31._24_4_ = uVar3;
                      auVar31._28_4_ = uVar3;
                      auVar128 = vminps_avx512vl(auVar128,auVar31);
                      break;
                    case 4:
                      auVar28._8_4_ = 0x80000000;
                      auVar28._0_8_ = 0x8000000080000000;
                      auVar28._12_4_ = 0x80000000;
                      auVar28._16_4_ = 0x80000000;
                      auVar28._20_4_ = 0x80000000;
                      auVar28._24_4_ = 0x80000000;
                      auVar28._28_4_ = 0x80000000;
                      auVar128 = vxorps_avx512vl(auVar128,auVar28);
                      auVar128 = vminps_avx(auVar128,auVar147);
                      auVar128 = vmaxps_avx(auVar128,auVar150);
                      auVar83 = vfmadd231ps_fma(auVar153,auVar128,auVar155);
                      auVar122 = vrndscaleps_avx512vl(ZEXT1632(auVar83),1);
                      uVar6 = vcmpps_avx512vl(ZEXT1632(auVar83),auVar122,1);
                      auVar119 = vsubps_avx512vl(auVar122,auVar157);
                      bVar18 = (bool)((byte)uVar6 & 1);
                      auVar127._0_4_ =
                           (uint)bVar18 * auVar119._0_4_ | (uint)!bVar18 * auVar122._0_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                      auVar127._4_4_ =
                           (uint)bVar18 * auVar119._4_4_ | (uint)!bVar18 * auVar122._4_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                      auVar127._8_4_ =
                           (uint)bVar18 * auVar119._8_4_ | (uint)!bVar18 * auVar122._8_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                      auVar127._12_4_ =
                           (uint)bVar18 * auVar119._12_4_ | (uint)!bVar18 * auVar122._12_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 4) & 1);
                      auVar127._16_4_ =
                           (uint)bVar18 * auVar119._16_4_ | (uint)!bVar18 * auVar122._16_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 5) & 1);
                      auVar127._20_4_ =
                           (uint)bVar18 * auVar119._20_4_ | (uint)!bVar18 * auVar122._20_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 6) & 1);
                      auVar127._24_4_ =
                           (uint)bVar18 * auVar119._24_4_ | (uint)!bVar18 * auVar122._24_4_;
                      bVar18 = SUB81(uVar6 >> 7,0);
                      auVar127._28_4_ =
                           (uint)bVar18 * auVar119._28_4_ | (uint)!bVar18 * auVar122._28_4_;
                      auVar128 = vfmsub231ps_avx512vl(auVar128,auVar127,auVar159);
                      auVar29._8_4_ = 0x395e8083;
                      auVar29._0_8_ = 0x395e8083395e8083;
                      auVar29._12_4_ = 0x395e8083;
                      auVar29._16_4_ = 0x395e8083;
                      auVar29._20_4_ = 0x395e8083;
                      auVar29._24_4_ = 0x395e8083;
                      auVar29._28_4_ = 0x395e8083;
                      auVar128 = vfmsub231ps_avx512vl(auVar128,auVar127,auVar29);
                      auVar162._0_4_ = auVar128._0_4_ * auVar128._0_4_;
                      auVar162._4_4_ = auVar128._4_4_ * auVar128._4_4_;
                      auVar162._8_4_ = auVar128._8_4_ * auVar128._8_4_;
                      auVar162._12_4_ = auVar128._12_4_ * auVar128._12_4_;
                      auVar162._16_4_ = auVar128._16_4_ * auVar128._16_4_;
                      auVar162._20_4_ = auVar128._20_4_ * auVar128._20_4_;
                      auVar162._24_4_ = auVar128._24_4_ * auVar128._24_4_;
                      auVar162._28_4_ = 0;
                      auVar83 = vfmadd213ps_fma(auVar106,auVar128,auVar170);
                      auVar83 = vfmadd213ps_fma(ZEXT1632(auVar83),auVar128,auVar172);
                      auVar83 = vfmadd213ps_fma(ZEXT1632(auVar83),auVar128,auVar174);
                      auVar83 = vfmadd213ps_fma(ZEXT1632(auVar83),auVar128,auVar176);
                      auVar83 = vfmadd213ps_fma(ZEXT1632(auVar83),auVar128,auVar153);
                      auVar83 = vfmadd213ps_fma(ZEXT1632(auVar83),auVar162,auVar128);
                      auVar163._0_4_ = auVar83._0_4_ + 1.0;
                      auVar163._4_4_ = auVar83._4_4_ + 1.0;
                      auVar163._8_4_ = auVar83._8_4_ + 1.0;
                      auVar163._12_4_ = auVar83._12_4_ + 1.0;
                      auVar163._16_4_ = 0x3f800000;
                      auVar163._20_4_ = 0x3f800000;
                      auVar163._24_4_ = 0x3f800000;
                      auVar163._28_4_ = 0x3f800000;
                      auVar128 = vcvttps2dq_avx512vl(auVar127);
                      auVar128 = vpslld_avx2(auVar128,0x17);
                      auVar128 = vpaddd_avx2(auVar178,auVar128);
                      auVar83 = vfmadd213ps_fma(auVar128,auVar163,auVar157);
                      auVar128 = vrcpps_avx(ZEXT1632(auVar83));
                      auVar83 = vfmsub213ps_fma(ZEXT1632(auVar83),auVar128,auVar157);
                      auVar83 = vfnmadd132ps_fma(ZEXT1632(auVar83),auVar128,auVar128);
                      auVar128 = ZEXT1632(auVar83);
                      break;
                    case 5:
                      auVar128 = vminps_avx(auVar128,auVar147);
                      auVar128 = vmaxps_avx(auVar128,auVar150);
                      auVar83 = vfmadd213ps_fma(auVar155,auVar128,auVar153);
                      auVar119 = vrndscaleps_avx512vl(ZEXT1632(auVar83),1);
                      uVar6 = vcmpps_avx512vl(ZEXT1632(auVar83),auVar119,1);
                      auVar120 = vsubps_avx512vl(auVar119,auVar157);
                      bVar18 = (bool)((byte)uVar6 & 1);
                      auVar121._0_4_ =
                           (uint)bVar18 * auVar120._0_4_ | (uint)!bVar18 * auVar119._0_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                      auVar121._4_4_ =
                           (uint)bVar18 * auVar120._4_4_ | (uint)!bVar18 * auVar119._4_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                      auVar121._8_4_ =
                           (uint)bVar18 * auVar120._8_4_ | (uint)!bVar18 * auVar119._8_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                      auVar121._12_4_ =
                           (uint)bVar18 * auVar120._12_4_ | (uint)!bVar18 * auVar119._12_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 4) & 1);
                      auVar121._16_4_ =
                           (uint)bVar18 * auVar120._16_4_ | (uint)!bVar18 * auVar119._16_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 5) & 1);
                      auVar121._20_4_ =
                           (uint)bVar18 * auVar120._20_4_ | (uint)!bVar18 * auVar119._20_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 6) & 1);
                      auVar121._24_4_ =
                           (uint)bVar18 * auVar120._24_4_ | (uint)!bVar18 * auVar119._24_4_;
                      bVar18 = SUB81(uVar6 >> 7,0);
                      auVar121._28_4_ =
                           (uint)bVar18 * auVar120._28_4_ | (uint)!bVar18 * auVar119._28_4_;
                      auVar128 = vfmsub231ps_avx512vl(auVar128,auVar121,auVar159);
                      auVar128 = vfnmsub231ps_avx512vl(auVar128,auVar121,auVar180);
                      auVar167._0_4_ = auVar128._0_4_ * auVar128._0_4_;
                      auVar167._4_4_ = auVar128._4_4_ * auVar128._4_4_;
                      auVar167._8_4_ = auVar128._8_4_ * auVar128._8_4_;
                      auVar167._12_4_ = auVar128._12_4_ * auVar128._12_4_;
                      auVar167._16_4_ = auVar128._16_4_ * auVar128._16_4_;
                      auVar167._20_4_ = auVar128._20_4_ * auVar128._20_4_;
                      auVar167._24_4_ = auVar128._24_4_ * auVar128._24_4_;
                      auVar167._28_4_ = 0;
                      auVar119 = vfmadd213ps_avx512vl(auVar106,auVar128,auVar170);
                      auVar119 = vfmadd213ps_avx512vl(auVar119,auVar128,auVar172);
                      auVar119 = vfmadd213ps_avx512vl(auVar119,auVar128,auVar174);
                      auVar119 = vfmadd213ps_avx512vl(auVar119,auVar128,auVar176);
                      auVar119 = vfmadd213ps_avx512vl(auVar119,auVar128,auVar153);
                      auVar128 = vfmadd213ps_avx512vl(auVar119,auVar167,auVar128);
                      auVar119 = vaddps_avx512vl(auVar128,auVar157);
                      auVar128 = vcvttps2dq_avx512vl(auVar121);
                      auVar128 = vpslld_avx2(auVar128,0x17);
                      auVar128 = vpaddd_avx2(auVar128,auVar178);
                      auVar83 = vfmadd213ps_fma(auVar128,auVar119,auVar157);
                      uVar6 = vcmpps_avx512vl(ZEXT1632(auVar83),auVar122,2);
                      auVar128._8_4_ = 0x800000;
                      auVar128._0_8_ = 0x80000000800000;
                      auVar128._12_4_ = 0x800000;
                      auVar128._16_4_ = 0x800000;
                      auVar128._20_4_ = 0x800000;
                      auVar128._24_4_ = 0x800000;
                      auVar128._28_4_ = 0x800000;
                      auVar128 = vmaxps_avx512vl(ZEXT1632(auVar83),auVar128);
                      auVar120 = vpsrld_avx2(auVar128,0x17);
                      auVar119 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
                      auVar122._8_4_ = 0x3f000000;
                      auVar122._0_8_ = 0x3f0000003f000000;
                      auVar122._12_4_ = 0x3f000000;
                      auVar122._16_4_ = 0x3f000000;
                      auVar122._20_4_ = 0x3f000000;
                      auVar122._24_4_ = 0x3f000000;
                      auVar122._28_4_ = 0x3f000000;
                      auVar128 = vpternlogd_avx512vl(auVar128,auVar119,auVar122,0xea);
                      uVar7 = vcmpps_avx512vl(auVar128,auVar107,1);
                      auVar122 = vaddps_avx512vl(auVar128,auVar108);
                      auVar128 = vaddps_avx512vl(auVar122,auVar128);
                      bVar18 = (bool)((byte)uVar7 & 1);
                      auVar123._0_4_ =
                           (uint)bVar18 * auVar128._0_4_ | (uint)!bVar18 * auVar122._0_4_;
                      bVar18 = (bool)((byte)(uVar7 >> 1) & 1);
                      auVar123._4_4_ =
                           (uint)bVar18 * auVar128._4_4_ | (uint)!bVar18 * auVar122._4_4_;
                      bVar18 = (bool)((byte)(uVar7 >> 2) & 1);
                      auVar123._8_4_ =
                           (uint)bVar18 * auVar128._8_4_ | (uint)!bVar18 * auVar122._8_4_;
                      bVar18 = (bool)((byte)(uVar7 >> 3) & 1);
                      auVar123._12_4_ =
                           (uint)bVar18 * auVar128._12_4_ | (uint)!bVar18 * auVar122._12_4_;
                      bVar18 = (bool)((byte)(uVar7 >> 4) & 1);
                      auVar123._16_4_ =
                           (uint)bVar18 * auVar128._16_4_ | (uint)!bVar18 * auVar122._16_4_;
                      bVar18 = (bool)((byte)(uVar7 >> 5) & 1);
                      auVar123._20_4_ =
                           (uint)bVar18 * auVar128._20_4_ | (uint)!bVar18 * auVar122._20_4_;
                      bVar18 = (bool)((byte)(uVar7 >> 6) & 1);
                      auVar123._24_4_ =
                           (uint)bVar18 * auVar128._24_4_ | (uint)!bVar18 * auVar122._24_4_;
                      bVar18 = SUB81(uVar7 >> 7,0);
                      auVar123._28_4_ =
                           (uint)bVar18 * auVar128._28_4_ | (uint)!bVar18 * auVar122._28_4_;
                      auVar122 = vmulps_avx512vl(auVar123,auVar123);
                      auVar128 = vfmadd213ps_avx512vl(auVar109,auVar123,auVar110);
                      auVar128 = vfmadd213ps_avx512vl(auVar128,auVar123,auVar111);
                      auVar128 = vfmadd213ps_avx512vl(auVar128,auVar123,auVar112);
                      auVar128 = vfmadd213ps_avx512vl(auVar128,auVar123,auVar113);
                      auVar128 = vfmadd213ps_avx512vl(auVar128,auVar123,auVar114);
                      auVar128 = vfmadd213ps_avx512vl(auVar128,auVar123,auVar115);
                      auVar128 = vfmadd213ps_avx512vl(auVar128,auVar123,auVar116);
                      auVar128 = vfmadd213ps_avx512vl(auVar128,auVar123,auVar117);
                      auVar119 = vmulps_avx512vl(auVar122,auVar123);
                      auVar119 = vmulps_avx512vl(auVar119,auVar128);
                      auVar27._8_4_ = 0xffffff82;
                      auVar27._0_8_ = 0xffffff82ffffff82;
                      auVar27._12_4_ = 0xffffff82;
                      auVar27._16_4_ = 0xffffff82;
                      auVar27._20_4_ = 0xffffff82;
                      auVar27._24_4_ = 0xffffff82;
                      auVar27._28_4_ = 0xffffff82;
                      auVar128 = vpaddd_avx512vl(auVar120,auVar27);
                      auVar128 = vcvtdq2ps_avx(auVar128);
                      auVar120 = vsubps_avx512vl(auVar128,auVar157);
                      bVar18 = (bool)((byte)uVar7 & 1);
                      auVar124._0_4_ =
                           (uint)bVar18 * auVar120._0_4_ | (uint)!bVar18 * auVar128._0_4_;
                      bVar18 = (bool)((byte)(uVar7 >> 1) & 1);
                      auVar124._4_4_ =
                           (uint)bVar18 * auVar120._4_4_ | (uint)!bVar18 * auVar128._4_4_;
                      bVar18 = (bool)((byte)(uVar7 >> 2) & 1);
                      auVar124._8_4_ =
                           (uint)bVar18 * auVar120._8_4_ | (uint)!bVar18 * auVar128._8_4_;
                      bVar18 = (bool)((byte)(uVar7 >> 3) & 1);
                      auVar124._12_4_ =
                           (uint)bVar18 * auVar120._12_4_ | (uint)!bVar18 * auVar128._12_4_;
                      bVar18 = (bool)((byte)(uVar7 >> 4) & 1);
                      auVar124._16_4_ =
                           (uint)bVar18 * auVar120._16_4_ | (uint)!bVar18 * auVar128._16_4_;
                      bVar18 = (bool)((byte)(uVar7 >> 5) & 1);
                      auVar124._20_4_ =
                           (uint)bVar18 * auVar120._20_4_ | (uint)!bVar18 * auVar128._20_4_;
                      bVar18 = (bool)((byte)(uVar7 >> 6) & 1);
                      auVar124._24_4_ =
                           (uint)bVar18 * auVar120._24_4_ | (uint)!bVar18 * auVar128._24_4_;
                      bVar18 = SUB81(uVar7 >> 7,0);
                      auVar124._28_4_ =
                           (uint)bVar18 * auVar120._28_4_ | (uint)!bVar18 * auVar128._28_4_;
                      auVar128 = vfmadd231ps_avx512vl(auVar119,auVar124,auVar180);
                      auVar128 = vfmsub231ps_avx512vl(auVar128,auVar153,auVar122);
                      auVar128 = vsubps_avx512vl(auVar128,auVar123);
                      auVar83 = vfmsub231ps_fma(auVar128,auVar159,auVar124);
                      auVar128 = vmulps_avx512vl(ZEXT1632(auVar83),auVar118);
                      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      bVar18 = (bool)((byte)uVar6 & 1);
                      auVar125._0_4_ =
                           (uint)bVar18 * auVar122._0_4_ | (uint)!bVar18 * auVar128._0_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                      auVar125._4_4_ =
                           (uint)bVar18 * auVar122._4_4_ | (uint)!bVar18 * auVar128._4_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                      auVar125._8_4_ =
                           (uint)bVar18 * auVar122._8_4_ | (uint)!bVar18 * auVar128._8_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                      auVar125._12_4_ =
                           (uint)bVar18 * auVar122._12_4_ | (uint)!bVar18 * auVar128._12_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 4) & 1);
                      auVar125._16_4_ =
                           (uint)bVar18 * auVar122._16_4_ | (uint)!bVar18 * auVar128._16_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 5) & 1);
                      auVar125._20_4_ =
                           (uint)bVar18 * auVar122._20_4_ | (uint)!bVar18 * auVar128._20_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 6) & 1);
                      auVar125._24_4_ =
                           (uint)bVar18 * auVar122._24_4_ | (uint)!bVar18 * auVar128._24_4_;
                      bVar18 = SUB81(uVar6 >> 7,0);
                      auVar125._28_4_ =
                           (uint)bVar18 * auVar122._28_4_ | (uint)!bVar18 * auVar128._28_4_;
                      auVar128 = vminps_avx(auVar125,auVar147);
                      auVar128 = vmaxps_avx(auVar128,auVar150);
                      auVar83 = vfmadd213ps_fma(auVar155,auVar128,auVar153);
                      auVar122 = vrndscaleps_avx512vl(ZEXT1632(auVar83),1);
                      uVar6 = vcmpps_avx512vl(ZEXT1632(auVar83),auVar122,1);
                      auVar119 = vsubps_avx512vl(auVar122,auVar157);
                      bVar18 = (bool)((byte)uVar6 & 1);
                      auVar126._0_4_ =
                           (uint)bVar18 * auVar119._0_4_ | (uint)!bVar18 * auVar122._0_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                      auVar126._4_4_ =
                           (uint)bVar18 * auVar119._4_4_ | (uint)!bVar18 * auVar122._4_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                      auVar126._8_4_ =
                           (uint)bVar18 * auVar119._8_4_ | (uint)!bVar18 * auVar122._8_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                      auVar126._12_4_ =
                           (uint)bVar18 * auVar119._12_4_ | (uint)!bVar18 * auVar122._12_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 4) & 1);
                      auVar126._16_4_ =
                           (uint)bVar18 * auVar119._16_4_ | (uint)!bVar18 * auVar122._16_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 5) & 1);
                      auVar126._20_4_ =
                           (uint)bVar18 * auVar119._20_4_ | (uint)!bVar18 * auVar122._20_4_;
                      bVar18 = (bool)((byte)(uVar6 >> 6) & 1);
                      auVar126._24_4_ =
                           (uint)bVar18 * auVar119._24_4_ | (uint)!bVar18 * auVar122._24_4_;
                      bVar18 = SUB81(uVar6 >> 7,0);
                      auVar126._28_4_ =
                           (uint)bVar18 * auVar119._28_4_ | (uint)!bVar18 * auVar122._28_4_;
                      auVar128 = vfmsub231ps_avx512vl(auVar128,auVar126,auVar159);
                      auVar128 = vfnmsub231ps_avx512vl(auVar128,auVar126,auVar180);
                      auVar168._0_4_ = auVar128._0_4_ * auVar128._0_4_;
                      auVar168._4_4_ = auVar128._4_4_ * auVar128._4_4_;
                      auVar168._8_4_ = auVar128._8_4_ * auVar128._8_4_;
                      auVar168._12_4_ = auVar128._12_4_ * auVar128._12_4_;
                      auVar168._16_4_ = auVar128._16_4_ * auVar128._16_4_;
                      auVar168._20_4_ = auVar128._20_4_ * auVar128._20_4_;
                      auVar168._24_4_ = auVar128._24_4_ * auVar128._24_4_;
                      auVar168._28_4_ = 0;
                      auVar122 = vfmadd213ps_avx512vl(auVar106,auVar128,auVar170);
                      auVar122 = vfmadd213ps_avx512vl(auVar122,auVar128,auVar172);
                      auVar122 = vfmadd213ps_avx512vl(auVar122,auVar128,auVar174);
                      auVar122 = vfmadd213ps_avx512vl(auVar122,auVar128,auVar176);
                      auVar122 = vfmadd213ps_avx512vl(auVar122,auVar128,auVar153);
                      auVar128 = vfmadd213ps_avx512vl(auVar122,auVar168,auVar128);
                      auVar122 = vaddps_avx512vl(auVar128,auVar157);
                      auVar128 = vcvttps2dq_avx512vl(auVar126);
                      auVar128 = vpslld_avx2(auVar128,0x17);
                      auVar128 = vpaddd_avx2(auVar128,auVar178);
                      auVar83 = vfmadd213ps_fma(auVar128,auVar122,auVar157);
                      auVar128 = vrcpps_avx(ZEXT1632(auVar83));
                      auVar83 = vfmsub213ps_fma(ZEXT1632(auVar83),auVar128,auVar157);
                      auVar83 = vfnmadd132ps_fma(ZEXT1632(auVar83),auVar128,auVar128);
                      auVar128 = vfnmadd213ps_avx512vl(ZEXT1632(auVar83),auVar118,auVar108);
                      auVar129._0_4_ = auVar128._0_4_ * auVar145._0_4_;
                      auVar129._4_4_ = auVar128._4_4_ * auVar145._4_4_;
                      auVar129._8_4_ = auVar128._8_4_ * auVar145._8_4_;
                      auVar129._12_4_ = auVar128._12_4_ * auVar145._12_4_;
                      auVar129._16_4_ = auVar128._16_4_ * auVar145._16_4_;
                      auVar129._20_4_ = auVar128._20_4_ * auVar145._20_4_;
                      auVar129._24_4_ = auVar128._24_4_ * auVar145._24_4_;
                      auVar128 = auVar129._0_32_;
                      break;
                    case 6:
                      uVar3 = **(undefined4 **)(&this->field_0x120 + (long)p_Var65);
                      auVar120._4_4_ = uVar3;
                      auVar120._0_4_ = uVar3;
                      auVar120._8_4_ = uVar3;
                      auVar120._12_4_ = uVar3;
                      auVar120._16_4_ = uVar3;
                      auVar120._20_4_ = uVar3;
                      auVar120._24_4_ = uVar3;
                      auVar120._28_4_ = uVar3;
                      uVar3 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var65))[1];
                      auVar119._4_4_ = uVar3;
                      auVar119._0_4_ = uVar3;
                      auVar119._8_4_ = uVar3;
                      auVar119._12_4_ = uVar3;
                      auVar119._16_4_ = uVar3;
                      auVar119._20_4_ = uVar3;
                      auVar119._24_4_ = uVar3;
                      auVar119._28_4_ = uVar3;
                      auVar128 = vfmadd213ps_avx512vl(auVar120,auVar128,auVar119);
                      auVar128 = vmaxps_avx(auVar128,auVar122);
                      auVar128 = vminps_avx(auVar128,auVar157);
                      auVar130._0_4_ = auVar128._0_4_ * auVar145._0_4_;
                      auVar130._4_4_ = auVar128._4_4_ * auVar145._4_4_;
                      auVar130._8_4_ = auVar128._8_4_ * auVar145._8_4_;
                      auVar130._12_4_ = auVar128._12_4_ * auVar145._12_4_;
                      auVar130._16_4_ = auVar128._16_4_ * auVar145._16_4_;
                      auVar130._20_4_ = auVar128._20_4_ * auVar145._20_4_;
                      auVar130._24_4_ = auVar128._24_4_ * auVar145._24_4_;
                      auVar130._28_36_ = auVar129._28_36_;
                      auVar128 = auVar130._0_32_;
                    }
                  }
                  *pauVar79 = auVar128;
                  pauVar79 = pauVar79 + 1;
                  iVar59 = iVar59 + 1;
                  local_2b8 = local_2b8 + 1;
                } while (iVar59 != _w);
              }
              iVar80 = iVar80 + 1;
            } while (iVar80 != _h);
          }
          local_2d8 = local_2d8 + 1;
          local_200 = pvVar76;
        } while (local_2d8 != uVar70);
        goto LAB_00460397;
      }
    }
    else if ((iVar75 == 0x10) && (0 < (int)uVar69)) {
      uVar12 = vpcmpd_avx512vl((undefined1  [16])0x0,local_188,1);
      uVar5 = (uVar12 & 0xf) >> 1;
      local_188._0_4_ = (int)uVar5;
      auVar145 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar129 = vxorps_avx512dq(auVar145,(undefined1  [64])_ps512_cephes_log_q2);
      auVar130 = vxorps_avx512dq(auVar145,(undefined1  [64])_ps512_cephes_log_q1);
      auVar131 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      auVar132 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar145);
      local_2d8 = 0;
      auVar83 = vxorps_avx512vl(auVar83,auVar83);
      auVar181 = ZEXT1664(auVar83);
      auVar133 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar134 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      do {
        if ((uVar5 & 1) != 0) {
          pvVar76 = (this->weight_data_tm).data;
          sVar81 = bottom_blob->cstep;
          sVar15 = bottom_blob->elemsize;
          pvVar14 = bottom_blob->data;
          iVar75 = bottom_blob->w;
          pauVar78 = (undefined1 (*) [64])
                     (local_248.cstep * local_2d8 * local_248.elemsize + (long)local_248.data);
          pp_Var66 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
          iVar62 = 0;
          do {
            if ((uVar12 & 1) != 0) {
              iVar58 = 0;
              local_2b8 = -local_128._0_4_;
              do {
                p_Var65 = pp_Var66[-3];
                if (*(int *)(&this->field_0x10c + (long)p_Var65) == 0) {
                  auVar135 = ZEXT1664((undefined1  [16])0x0);
                }
                else {
                  auVar135 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                                (*(long *)(&this->field_0x1b0 + (long)p_Var65) +
                                                local_2d8 * 0x40));
                }
                if (0 < *(int *)(&this->field_0xd8 + (long)p_Var65)) {
                  iVar80 = 0;
                  iVar56 = 0;
                  do {
                    iVar59 = *(int *)(&this->field_0xe0 + (long)p_Var65) * iVar56 +
                             (iVar62 - local_128._4_4_);
                    if (((-1 < iVar59) &&
                        (iVar60 = iVar59 / *(int *)(&this->field_0xe8 + (long)p_Var65),
                        iVar59 % *(int *)(&this->field_0xe8 + (long)p_Var65) == 0)) &&
                       (iVar60 < iStack_194)) {
                      lVar71 = (long)*(int *)(&this->field_0xd4 + (long)p_Var65);
                      if (0 < lVar71) {
                        uVar74 = *(int *)(&this->field_0xd4 + (long)p_Var65) * iVar80;
                        iVar59 = local_2b8;
                        do {
                          if (((-1 < iVar59) &&
                              (iVar61 = iVar59 / *(int *)(&this->field_0xe4 + (long)p_Var65),
                              iVar59 % *(int *)(&this->field_0xe4 + (long)p_Var65) == 0)) &&
                             (iVar61 < local_198)) {
                            auVar135 = vfmadd231ps_avx512f(auVar135,*(undefined1 (*) [64])
                                                                     ((long)pvVar14 +
                                                                     (long)(iVar61 << 4) * 4 +
                                                                     (long)iVar60 *
                                                                     (long)iVar75 * sVar15 +
                                                                     sVar81 * local_2d8 * sVar15),
                                                           *(undefined1 (*) [64])
                                                            ((long)pvVar76 +
                                                            (ulong)uVar74 * 4 +
                                                            (long)(iVar57 * 0x10 * (int)local_2d8) *
                                                            4));
                          }
                          uVar74 = uVar74 + 0x10;
                          iVar59 = iVar59 + *(int *)(&this->field_0xdc + (long)p_Var65);
                          lVar71 = lVar71 + -1;
                        } while (lVar71 != 0);
                      }
                    }
                    iVar56 = iVar56 + 1;
                    iVar80 = iVar80 + 0x10;
                  } while (iVar56 != *(int *)(&this->field_0xd8 + (long)p_Var65));
                }
                switch(*(undefined4 *)(&this->field_0x118 + (long)p_Var65)) {
                case 1:
                  auVar135 = vmaxps_avx512f(auVar135,auVar181);
                  break;
                case 2:
                  uVar6 = vcmpps_avx512f(auVar135,auVar181,1);
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var65);
                  auVar34._4_4_ = uVar1;
                  auVar34._0_4_ = uVar1;
                  auVar34._8_4_ = uVar1;
                  auVar34._12_4_ = uVar1;
                  auVar34._16_4_ = uVar1;
                  auVar34._20_4_ = uVar1;
                  auVar34._24_4_ = uVar1;
                  auVar34._28_4_ = uVar1;
                  auVar34._32_4_ = uVar1;
                  auVar34._36_4_ = uVar1;
                  auVar34._40_4_ = uVar1;
                  auVar34._44_4_ = uVar1;
                  auVar34._48_4_ = uVar1;
                  auVar34._52_4_ = uVar1;
                  auVar34._56_4_ = uVar1;
                  auVar34._60_4_ = uVar1;
                  auVar143 = vmulps_avx512f(auVar135,auVar34);
                  bVar18 = (bool)((byte)uVar6 & 1);
                  auVar141._0_4_ = (uint)bVar18 * auVar143._0_4_ | (uint)!bVar18 * auVar135._0_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                  auVar141._4_4_ = (uint)bVar18 * auVar143._4_4_ | (uint)!bVar18 * auVar135._4_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                  auVar141._8_4_ = (uint)bVar18 * auVar143._8_4_ | (uint)!bVar18 * auVar135._8_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                  auVar141._12_4_ = (uint)bVar18 * auVar143._12_4_ | (uint)!bVar18 * auVar135._12_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 4) & 1);
                  auVar141._16_4_ = (uint)bVar18 * auVar143._16_4_ | (uint)!bVar18 * auVar135._16_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 5) & 1);
                  auVar141._20_4_ = (uint)bVar18 * auVar143._20_4_ | (uint)!bVar18 * auVar135._20_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 6) & 1);
                  auVar141._24_4_ = (uint)bVar18 * auVar143._24_4_ | (uint)!bVar18 * auVar135._24_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 7) & 1);
                  auVar141._28_4_ = (uint)bVar18 * auVar143._28_4_ | (uint)!bVar18 * auVar135._28_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 8) & 1);
                  auVar141._32_4_ = (uint)bVar18 * auVar143._32_4_ | (uint)!bVar18 * auVar135._32_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 9) & 1);
                  auVar141._36_4_ = (uint)bVar18 * auVar143._36_4_ | (uint)!bVar18 * auVar135._36_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 10) & 1);
                  auVar141._40_4_ = (uint)bVar18 * auVar143._40_4_ | (uint)!bVar18 * auVar135._40_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xb) & 1);
                  auVar141._44_4_ = (uint)bVar18 * auVar143._44_4_ | (uint)!bVar18 * auVar135._44_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xc) & 1);
                  auVar141._48_4_ = (uint)bVar18 * auVar143._48_4_ | (uint)!bVar18 * auVar135._48_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xd) & 1);
                  auVar141._52_4_ = (uint)bVar18 * auVar143._52_4_ | (uint)!bVar18 * auVar135._52_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xe) & 1);
                  auVar141._56_4_ = (uint)bVar18 * auVar143._56_4_ | (uint)!bVar18 * auVar135._56_4_
                  ;
                  bVar18 = SUB81(uVar6 >> 0xf,0);
                  auVar141._60_4_ = (uint)bVar18 * auVar143._60_4_ | (uint)!bVar18 * auVar135._60_4_
                  ;
                  auVar135 = auVar141;
                  break;
                case 3:
                  uVar1 = **(undefined4 **)(&this->field_0x120 + (long)p_Var65);
                  auVar33._4_4_ = uVar1;
                  auVar33._0_4_ = uVar1;
                  auVar33._8_4_ = uVar1;
                  auVar33._12_4_ = uVar1;
                  auVar33._16_4_ = uVar1;
                  auVar33._20_4_ = uVar1;
                  auVar33._24_4_ = uVar1;
                  auVar33._28_4_ = uVar1;
                  auVar33._32_4_ = uVar1;
                  auVar33._36_4_ = uVar1;
                  auVar33._40_4_ = uVar1;
                  auVar33._44_4_ = uVar1;
                  auVar33._48_4_ = uVar1;
                  auVar33._52_4_ = uVar1;
                  auVar33._56_4_ = uVar1;
                  auVar33._60_4_ = uVar1;
                  auVar143 = vmaxps_avx512f(auVar135,auVar33);
                  uVar1 = (*(undefined4 **)(&this->field_0x120 + (long)p_Var65))[1];
                  auVar135._4_4_ = uVar1;
                  auVar135._0_4_ = uVar1;
                  auVar135._8_4_ = uVar1;
                  auVar135._12_4_ = uVar1;
                  auVar135._16_4_ = uVar1;
                  auVar135._20_4_ = uVar1;
                  auVar135._24_4_ = uVar1;
                  auVar135._28_4_ = uVar1;
                  auVar135._32_4_ = uVar1;
                  auVar135._36_4_ = uVar1;
                  auVar135._40_4_ = uVar1;
                  auVar135._44_4_ = uVar1;
                  auVar135._48_4_ = uVar1;
                  auVar135._52_4_ = uVar1;
                  auVar135._56_4_ = uVar1;
                  auVar135._60_4_ = uVar1;
                  auVar135 = vminps_avx512f(auVar143,auVar135);
                  break;
                case 4:
                  auVar135 = vxorps_avx512dq(auVar135,auVar145);
                  auVar135 = vminps_avx512f(auVar135,(undefined1  [64])afVar36);
                  auVar135 = vmaxps_avx512f(auVar135,(undefined1  [64])afVar37);
                  auVar143 = vfmadd213ps_avx512f((undefined1  [64])afVar38,auVar135,
                                                 (undefined1  [64])afVar44);
                  auVar142 = vrndscaleps_avx512f(auVar143,1);
                  uVar6 = vcmpps_avx512f(auVar143,auVar142,1);
                  auVar143 = vsubps_avx512f(auVar142,(undefined1  [64])afVar35);
                  bVar18 = (bool)((byte)uVar6 & 1);
                  auVar136._0_4_ = (uint)bVar18 * auVar143._0_4_ | (uint)!bVar18 * auVar142._0_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                  auVar136._4_4_ = (uint)bVar18 * auVar143._4_4_ | (uint)!bVar18 * auVar142._4_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                  auVar136._8_4_ = (uint)bVar18 * auVar143._8_4_ | (uint)!bVar18 * auVar142._8_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                  auVar136._12_4_ = (uint)bVar18 * auVar143._12_4_ | (uint)!bVar18 * auVar142._12_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 4) & 1);
                  auVar136._16_4_ = (uint)bVar18 * auVar143._16_4_ | (uint)!bVar18 * auVar142._16_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 5) & 1);
                  auVar136._20_4_ = (uint)bVar18 * auVar143._20_4_ | (uint)!bVar18 * auVar142._20_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 6) & 1);
                  auVar136._24_4_ = (uint)bVar18 * auVar143._24_4_ | (uint)!bVar18 * auVar142._24_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 7) & 1);
                  auVar136._28_4_ = (uint)bVar18 * auVar143._28_4_ | (uint)!bVar18 * auVar142._28_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 8) & 1);
                  auVar136._32_4_ = (uint)bVar18 * auVar143._32_4_ | (uint)!bVar18 * auVar142._32_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 9) & 1);
                  auVar136._36_4_ = (uint)bVar18 * auVar143._36_4_ | (uint)!bVar18 * auVar142._36_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 10) & 1);
                  auVar136._40_4_ = (uint)bVar18 * auVar143._40_4_ | (uint)!bVar18 * auVar142._40_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xb) & 1);
                  auVar136._44_4_ = (uint)bVar18 * auVar143._44_4_ | (uint)!bVar18 * auVar142._44_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xc) & 1);
                  auVar136._48_4_ = (uint)bVar18 * auVar143._48_4_ | (uint)!bVar18 * auVar142._48_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xd) & 1);
                  auVar136._52_4_ = (uint)bVar18 * auVar143._52_4_ | (uint)!bVar18 * auVar142._52_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xe) & 1);
                  auVar136._56_4_ = (uint)bVar18 * auVar143._56_4_ | (uint)!bVar18 * auVar142._56_4_
                  ;
                  bVar18 = SUB81(uVar6 >> 0xf,0);
                  auVar136._60_4_ = (uint)bVar18 * auVar143._60_4_ | (uint)!bVar18 * auVar142._60_4_
                  ;
                  auVar135 = vfmadd231ps_avx512f(auVar135,auVar136,auVar129);
                  auVar135 = vfmadd231ps_avx512f(auVar135,auVar136,auVar130);
                  auVar143 = vmulps_avx512f(auVar135,auVar135);
                  auVar142 = vfmadd213ps_avx512f(auVar135,(undefined1  [64])afVar39,
                                                 (undefined1  [64])afVar40);
                  auVar142 = vfmadd213ps_avx512f(auVar142,auVar135,(undefined1  [64])afVar41);
                  auVar142 = vfmadd213ps_avx512f(auVar142,auVar135,(undefined1  [64])afVar42);
                  auVar142 = vfmadd213ps_avx512f(auVar142,auVar135,(undefined1  [64])afVar43);
                  auVar142 = vfmadd213ps_avx512f(auVar142,auVar135,(undefined1  [64])afVar44);
                  auVar135 = vfmadd213ps_avx512f(auVar142,auVar143,auVar135);
                  auVar135 = vaddps_avx512f(auVar135,(undefined1  [64])afVar35);
                  auVar143 = vcvttps2dq_avx512f(auVar136);
                  auVar143 = vpaddd_avx512f(auVar131,auVar143);
                  auVar143 = vpslld_avx512f(auVar143,0x17);
                  auVar135 = vfmadd213ps_avx512f(auVar143,auVar135,auVar133);
                  auVar143 = vrcp14ps_avx512f(auVar135);
                  auVar135 = vfmsub213ps_avx512f(auVar135,auVar143,auVar133);
                  auVar135 = vfnmadd132ps_avx512vl(auVar135,auVar143,auVar143);
                  break;
                case 5:
                  auVar143 = vminps_avx512f(auVar135,(undefined1  [64])afVar36);
                  auVar143 = vmaxps_avx512f(auVar143,(undefined1  [64])afVar37);
                  auVar142 = vfmadd213ps_avx512f((undefined1  [64])afVar38,auVar143,
                                                 (undefined1  [64])afVar44);
                  auVar136 = vrndscaleps_avx512f(auVar142,1);
                  uVar6 = vcmpps_avx512f(auVar142,auVar136,1);
                  auVar142 = vsubps_avx512f(auVar136,(undefined1  [64])afVar35);
                  bVar18 = (bool)((byte)uVar6 & 1);
                  auVar137._0_4_ = (uint)bVar18 * auVar142._0_4_ | (uint)!bVar18 * auVar136._0_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                  auVar137._4_4_ = (uint)bVar18 * auVar142._4_4_ | (uint)!bVar18 * auVar136._4_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                  auVar137._8_4_ = (uint)bVar18 * auVar142._8_4_ | (uint)!bVar18 * auVar136._8_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                  auVar137._12_4_ = (uint)bVar18 * auVar142._12_4_ | (uint)!bVar18 * auVar136._12_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 4) & 1);
                  auVar137._16_4_ = (uint)bVar18 * auVar142._16_4_ | (uint)!bVar18 * auVar136._16_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 5) & 1);
                  auVar137._20_4_ = (uint)bVar18 * auVar142._20_4_ | (uint)!bVar18 * auVar136._20_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 6) & 1);
                  auVar137._24_4_ = (uint)bVar18 * auVar142._24_4_ | (uint)!bVar18 * auVar136._24_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 7) & 1);
                  auVar137._28_4_ = (uint)bVar18 * auVar142._28_4_ | (uint)!bVar18 * auVar136._28_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 8) & 1);
                  auVar137._32_4_ = (uint)bVar18 * auVar142._32_4_ | (uint)!bVar18 * auVar136._32_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 9) & 1);
                  auVar137._36_4_ = (uint)bVar18 * auVar142._36_4_ | (uint)!bVar18 * auVar136._36_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 10) & 1);
                  auVar137._40_4_ = (uint)bVar18 * auVar142._40_4_ | (uint)!bVar18 * auVar136._40_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xb) & 1);
                  auVar137._44_4_ = (uint)bVar18 * auVar142._44_4_ | (uint)!bVar18 * auVar136._44_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xc) & 1);
                  auVar137._48_4_ = (uint)bVar18 * auVar142._48_4_ | (uint)!bVar18 * auVar136._48_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xd) & 1);
                  auVar137._52_4_ = (uint)bVar18 * auVar142._52_4_ | (uint)!bVar18 * auVar136._52_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xe) & 1);
                  auVar137._56_4_ = (uint)bVar18 * auVar142._56_4_ | (uint)!bVar18 * auVar136._56_4_
                  ;
                  bVar18 = SUB81(uVar6 >> 0xf,0);
                  auVar137._60_4_ = (uint)bVar18 * auVar142._60_4_ | (uint)!bVar18 * auVar136._60_4_
                  ;
                  auVar143 = vfmadd231ps_avx512f(auVar143,auVar137,auVar129);
                  auVar143 = vfmadd231ps_avx512f(auVar143,auVar137,auVar130);
                  auVar142 = vmulps_avx512f(auVar143,auVar143);
                  auVar136 = vfmadd213ps_avx512f(auVar143,(undefined1  [64])afVar39,
                                                 (undefined1  [64])afVar40);
                  auVar136 = vfmadd213ps_avx512f(auVar136,auVar143,(undefined1  [64])afVar41);
                  auVar136 = vfmadd213ps_avx512f(auVar136,auVar143,(undefined1  [64])afVar42);
                  auVar136 = vfmadd213ps_avx512f(auVar136,auVar143,(undefined1  [64])afVar43);
                  auVar136 = vfmadd213ps_avx512f(auVar136,auVar143,(undefined1  [64])afVar44);
                  auVar143 = vfmadd213ps_avx512f(auVar136,auVar142,auVar143);
                  auVar143 = vaddps_avx512f(auVar143,(undefined1  [64])afVar35);
                  auVar142 = vcvttps2dq_avx512f(auVar137);
                  auVar142 = vpaddd_avx512f(auVar131,auVar142);
                  auVar142 = vpslld_avx512f(auVar142,0x17);
                  auVar143 = vfmadd213ps_avx512f(auVar142,auVar143,auVar133);
                  auVar142 = vmaxps_avx512f(auVar143,(undefined1  [64])_ps512_min_norm_pos);
                  auVar136 = vpsrld_avx512f(auVar142,0x17);
                  auVar142 = vpternlogd_avx512f(auVar142,(undefined1  [64])afVar44,
                                                (undefined1  [64])_ps512_inv_mant_mask,0xec);
                  uVar6 = vcmpps_avx512f(auVar142,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                  auVar137 = vsubps_avx512f(auVar142,(undefined1  [64])afVar35);
                  auVar142 = vaddps_avx512f(auVar137,auVar142);
                  bVar18 = (bool)((byte)uVar6 & 1);
                  auVar138._0_4_ = (uint)bVar18 * auVar142._0_4_ | (uint)!bVar18 * auVar137._0_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                  auVar138._4_4_ = (uint)bVar18 * auVar142._4_4_ | (uint)!bVar18 * auVar137._4_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                  auVar138._8_4_ = (uint)bVar18 * auVar142._8_4_ | (uint)!bVar18 * auVar137._8_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                  auVar138._12_4_ = (uint)bVar18 * auVar142._12_4_ | (uint)!bVar18 * auVar137._12_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 4) & 1);
                  auVar138._16_4_ = (uint)bVar18 * auVar142._16_4_ | (uint)!bVar18 * auVar137._16_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 5) & 1);
                  auVar138._20_4_ = (uint)bVar18 * auVar142._20_4_ | (uint)!bVar18 * auVar137._20_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 6) & 1);
                  auVar138._24_4_ = (uint)bVar18 * auVar142._24_4_ | (uint)!bVar18 * auVar137._24_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 7) & 1);
                  auVar138._28_4_ = (uint)bVar18 * auVar142._28_4_ | (uint)!bVar18 * auVar137._28_4_
                  ;
                  bVar19 = (byte)(uVar6 >> 8);
                  bVar18 = (bool)(bVar19 & 1);
                  auVar138._32_4_ = (uint)bVar18 * auVar142._32_4_ | (uint)!bVar18 * auVar137._32_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 9) & 1);
                  auVar138._36_4_ = (uint)bVar18 * auVar142._36_4_ | (uint)!bVar18 * auVar137._36_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 10) & 1);
                  auVar138._40_4_ = (uint)bVar18 * auVar142._40_4_ | (uint)!bVar18 * auVar137._40_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xb) & 1);
                  auVar138._44_4_ = (uint)bVar18 * auVar142._44_4_ | (uint)!bVar18 * auVar137._44_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xc) & 1);
                  auVar138._48_4_ = (uint)bVar18 * auVar142._48_4_ | (uint)!bVar18 * auVar137._48_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xd) & 1);
                  auVar138._52_4_ = (uint)bVar18 * auVar142._52_4_ | (uint)!bVar18 * auVar137._52_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xe) & 1);
                  auVar138._56_4_ = (uint)bVar18 * auVar142._56_4_ | (uint)!bVar18 * auVar137._56_4_
                  ;
                  bVar18 = SUB81(uVar6 >> 0xf,0);
                  auVar138._60_4_ = (uint)bVar18 * auVar142._60_4_ | (uint)!bVar18 * auVar137._60_4_
                  ;
                  auVar142 = vmulps_avx512f(auVar138,auVar138);
                  auVar137 = vfmadd132ps_avx512f(auVar138,(undefined1  [64])_ps512_cephes_log_p1,
                                                 (undefined1  [64])_ps512_cephes_log_p0);
                  auVar137 = vfmadd213ps_avx512f(auVar137,auVar138,(undefined1  [64])afVar45);
                  auVar137 = vfmadd213ps_avx512f(auVar137,auVar138,(undefined1  [64])afVar46);
                  auVar137 = vfmadd213ps_avx512f(auVar137,auVar138,(undefined1  [64])afVar47);
                  auVar137 = vfmadd213ps_avx512f(auVar137,auVar138,(undefined1  [64])afVar48);
                  auVar137 = vfmadd213ps_avx512f(auVar137,auVar138,(undefined1  [64])afVar49);
                  auVar137 = vfmadd213ps_avx512f(auVar137,auVar138,(undefined1  [64])afVar50);
                  auVar137 = vfmadd213ps_avx512f(auVar137,auVar138,(undefined1  [64])afVar51);
                  auVar139 = vmulps_avx512f(auVar142,auVar138);
                  auVar137 = vfmadd213ps_avx512f(auVar139,auVar137,auVar138);
                  uVar7 = vcmpps_avx512f(auVar143,auVar181,2);
                  auVar143 = vpsubd_avx512f(auVar136,auVar131);
                  auVar143 = vcvtdq2ps_avx512f(auVar143);
                  auVar136 = vaddps_avx512f(auVar143,(undefined1  [64])afVar35);
                  bVar18 = (bool)((byte)uVar6 & 1);
                  auVar139._0_4_ = (uint)bVar18 * auVar143._0_4_ | (uint)!bVar18 * auVar136._0_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                  auVar139._4_4_ = (uint)bVar18 * auVar143._4_4_ | (uint)!bVar18 * auVar136._4_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                  auVar139._8_4_ = (uint)bVar18 * auVar143._8_4_ | (uint)!bVar18 * auVar136._8_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                  auVar139._12_4_ = (uint)bVar18 * auVar143._12_4_ | (uint)!bVar18 * auVar136._12_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 4) & 1);
                  auVar139._16_4_ = (uint)bVar18 * auVar143._16_4_ | (uint)!bVar18 * auVar136._16_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 5) & 1);
                  auVar139._20_4_ = (uint)bVar18 * auVar143._20_4_ | (uint)!bVar18 * auVar136._20_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 6) & 1);
                  auVar139._24_4_ = (uint)bVar18 * auVar143._24_4_ | (uint)!bVar18 * auVar136._24_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 7) & 1);
                  auVar139._28_4_ = (uint)bVar18 * auVar143._28_4_ | (uint)!bVar18 * auVar136._28_4_
                  ;
                  bVar18 = (bool)(bVar19 & 1);
                  auVar139._32_4_ = (uint)bVar18 * auVar143._32_4_ | (uint)!bVar18 * auVar136._32_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 9) & 1);
                  auVar139._36_4_ = (uint)bVar18 * auVar143._36_4_ | (uint)!bVar18 * auVar136._36_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 10) & 1);
                  auVar139._40_4_ = (uint)bVar18 * auVar143._40_4_ | (uint)!bVar18 * auVar136._40_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xb) & 1);
                  auVar139._44_4_ = (uint)bVar18 * auVar143._44_4_ | (uint)!bVar18 * auVar136._44_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xc) & 1);
                  auVar139._48_4_ = (uint)bVar18 * auVar143._48_4_ | (uint)!bVar18 * auVar136._48_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xd) & 1);
                  auVar139._52_4_ = (uint)bVar18 * auVar143._52_4_ | (uint)!bVar18 * auVar136._52_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xe) & 1);
                  auVar139._56_4_ = (uint)bVar18 * auVar143._56_4_ | (uint)!bVar18 * auVar136._56_4_
                  ;
                  bVar18 = SUB81(uVar6 >> 0xf,0);
                  auVar139._60_4_ = (uint)bVar18 * auVar143._60_4_ | (uint)!bVar18 * auVar136._60_4_
                  ;
                  auVar143 = vfmadd231ps_avx512f(auVar137,auVar139,
                                                 (undefined1  [64])_ps512_cephes_log_q1);
                  auVar143 = vfmadd231ps_avx512f(auVar143,auVar132,auVar142);
                  auVar143 = vfmadd231ps_avx512f(auVar143,auVar139,
                                                 (undefined1  [64])_ps512_cephes_log_q2);
                  auVar143 = vmulps_avx512f(auVar143,auVar134);
                  auVar136 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                  bVar18 = (bool)((byte)uVar7 & 1);
                  auVar142._0_4_ = (uint)bVar18 * auVar136._0_4_ | (uint)!bVar18 * auVar143._0_4_;
                  bVar18 = (bool)((byte)(uVar7 >> 1) & 1);
                  auVar142._4_4_ = (uint)bVar18 * auVar136._4_4_ | (uint)!bVar18 * auVar143._4_4_;
                  bVar18 = (bool)((byte)(uVar7 >> 2) & 1);
                  auVar142._8_4_ = (uint)bVar18 * auVar136._8_4_ | (uint)!bVar18 * auVar143._8_4_;
                  bVar18 = (bool)((byte)(uVar7 >> 3) & 1);
                  auVar142._12_4_ = (uint)bVar18 * auVar136._12_4_ | (uint)!bVar18 * auVar143._12_4_
                  ;
                  bVar18 = (bool)((byte)(uVar7 >> 4) & 1);
                  auVar142._16_4_ = (uint)bVar18 * auVar136._16_4_ | (uint)!bVar18 * auVar143._16_4_
                  ;
                  bVar18 = (bool)((byte)(uVar7 >> 5) & 1);
                  auVar142._20_4_ = (uint)bVar18 * auVar136._20_4_ | (uint)!bVar18 * auVar143._20_4_
                  ;
                  bVar18 = (bool)((byte)(uVar7 >> 6) & 1);
                  auVar142._24_4_ = (uint)bVar18 * auVar136._24_4_ | (uint)!bVar18 * auVar143._24_4_
                  ;
                  bVar18 = (bool)((byte)(uVar7 >> 7) & 1);
                  auVar142._28_4_ = (uint)bVar18 * auVar136._28_4_ | (uint)!bVar18 * auVar143._28_4_
                  ;
                  bVar18 = (bool)((byte)(uVar7 >> 8) & 1);
                  auVar142._32_4_ = (uint)bVar18 * auVar136._32_4_ | (uint)!bVar18 * auVar143._32_4_
                  ;
                  bVar18 = (bool)((byte)(uVar7 >> 9) & 1);
                  auVar142._36_4_ = (uint)bVar18 * auVar136._36_4_ | (uint)!bVar18 * auVar143._36_4_
                  ;
                  bVar18 = (bool)((byte)(uVar7 >> 10) & 1);
                  auVar142._40_4_ = (uint)bVar18 * auVar136._40_4_ | (uint)!bVar18 * auVar143._40_4_
                  ;
                  bVar18 = (bool)((byte)(uVar7 >> 0xb) & 1);
                  auVar142._44_4_ = (uint)bVar18 * auVar136._44_4_ | (uint)!bVar18 * auVar143._44_4_
                  ;
                  bVar18 = (bool)((byte)(uVar7 >> 0xc) & 1);
                  auVar142._48_4_ = (uint)bVar18 * auVar136._48_4_ | (uint)!bVar18 * auVar143._48_4_
                  ;
                  bVar18 = (bool)((byte)(uVar7 >> 0xd) & 1);
                  auVar142._52_4_ = (uint)bVar18 * auVar136._52_4_ | (uint)!bVar18 * auVar143._52_4_
                  ;
                  bVar18 = (bool)((byte)(uVar7 >> 0xe) & 1);
                  auVar142._56_4_ = (uint)bVar18 * auVar136._56_4_ | (uint)!bVar18 * auVar143._56_4_
                  ;
                  bVar18 = SUB81(uVar7 >> 0xf,0);
                  auVar142._60_4_ = (uint)bVar18 * auVar136._60_4_ | (uint)!bVar18 * auVar143._60_4_
                  ;
                  auVar143 = vminps_avx512f(auVar142,(undefined1  [64])afVar36);
                  auVar143 = vmaxps_avx512f(auVar143,(undefined1  [64])afVar37);
                  auVar142 = vfmadd213ps_avx512f((undefined1  [64])afVar38,auVar143,
                                                 (undefined1  [64])afVar44);
                  auVar136 = vrndscaleps_avx512f(auVar142,1);
                  uVar6 = vcmpps_avx512f(auVar142,auVar136,1);
                  auVar142 = vsubps_avx512f(auVar136,(undefined1  [64])afVar35);
                  bVar18 = (bool)((byte)uVar6 & 1);
                  auVar140._0_4_ = (uint)bVar18 * auVar142._0_4_ | (uint)!bVar18 * auVar136._0_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 1) & 1);
                  auVar140._4_4_ = (uint)bVar18 * auVar142._4_4_ | (uint)!bVar18 * auVar136._4_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 2) & 1);
                  auVar140._8_4_ = (uint)bVar18 * auVar142._8_4_ | (uint)!bVar18 * auVar136._8_4_;
                  bVar18 = (bool)((byte)(uVar6 >> 3) & 1);
                  auVar140._12_4_ = (uint)bVar18 * auVar142._12_4_ | (uint)!bVar18 * auVar136._12_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 4) & 1);
                  auVar140._16_4_ = (uint)bVar18 * auVar142._16_4_ | (uint)!bVar18 * auVar136._16_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 5) & 1);
                  auVar140._20_4_ = (uint)bVar18 * auVar142._20_4_ | (uint)!bVar18 * auVar136._20_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 6) & 1);
                  auVar140._24_4_ = (uint)bVar18 * auVar142._24_4_ | (uint)!bVar18 * auVar136._24_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 7) & 1);
                  auVar140._28_4_ = (uint)bVar18 * auVar142._28_4_ | (uint)!bVar18 * auVar136._28_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 8) & 1);
                  auVar140._32_4_ = (uint)bVar18 * auVar142._32_4_ | (uint)!bVar18 * auVar136._32_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 9) & 1);
                  auVar140._36_4_ = (uint)bVar18 * auVar142._36_4_ | (uint)!bVar18 * auVar136._36_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 10) & 1);
                  auVar140._40_4_ = (uint)bVar18 * auVar142._40_4_ | (uint)!bVar18 * auVar136._40_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xb) & 1);
                  auVar140._44_4_ = (uint)bVar18 * auVar142._44_4_ | (uint)!bVar18 * auVar136._44_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xc) & 1);
                  auVar140._48_4_ = (uint)bVar18 * auVar142._48_4_ | (uint)!bVar18 * auVar136._48_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xd) & 1);
                  auVar140._52_4_ = (uint)bVar18 * auVar142._52_4_ | (uint)!bVar18 * auVar136._52_4_
                  ;
                  bVar18 = (bool)((byte)(uVar6 >> 0xe) & 1);
                  auVar140._56_4_ = (uint)bVar18 * auVar142._56_4_ | (uint)!bVar18 * auVar136._56_4_
                  ;
                  bVar18 = SUB81(uVar6 >> 0xf,0);
                  auVar140._60_4_ = (uint)bVar18 * auVar142._60_4_ | (uint)!bVar18 * auVar136._60_4_
                  ;
                  auVar143 = vfmadd231ps_avx512f(auVar143,auVar140,auVar129);
                  auVar143 = vfmadd231ps_avx512f(auVar143,auVar140,auVar130);
                  auVar142 = vmulps_avx512f(auVar143,auVar143);
                  auVar136 = vfmadd213ps_avx512f(auVar143,(undefined1  [64])afVar39,
                                                 (undefined1  [64])afVar40);
                  auVar136 = vfmadd213ps_avx512f(auVar136,auVar143,(undefined1  [64])afVar41);
                  auVar136 = vfmadd213ps_avx512f(auVar136,auVar143,(undefined1  [64])afVar42);
                  auVar136 = vfmadd213ps_avx512f(auVar136,auVar143,(undefined1  [64])afVar43);
                  auVar136 = vfmadd213ps_avx512f(auVar136,auVar143,(undefined1  [64])afVar44);
                  auVar143 = vfmadd213ps_avx512f(auVar136,auVar142,auVar143);
                  auVar143 = vaddps_avx512f(auVar143,(undefined1  [64])afVar35);
                  auVar142 = vcvttps2dq_avx512f(auVar140);
                  auVar142 = vpaddd_avx512f(auVar142,auVar131);
                  auVar142 = vpslld_avx512f(auVar142,0x17);
                  auVar143 = vfmadd213ps_avx512f(auVar142,auVar143,auVar133);
                  auVar142 = vrcp14ps_avx512f(auVar143);
                  auVar143 = vfmsub213ps_avx512f(auVar143,auVar142,auVar133);
                  auVar143 = vfnmadd132ps_avx512vl(auVar143,auVar142,auVar142);
                  auVar143 = vfnmsub213ps_avx512f(auVar143,auVar134,auVar133);
                  auVar135 = vmulps_avx512f(auVar143,auVar135);
                  break;
                case 6:
                  auVar142 = vbroadcastss_avx512f
                                       (ZEXT416(**(uint **)(&this->field_0x120 + (long)p_Var65)));
                  uVar74 = (*(uint **)(&this->field_0x120 + (long)p_Var65))[1];
                  auVar143._4_4_ = uVar74;
                  auVar143._0_4_ = uVar74;
                  auVar143._8_4_ = uVar74;
                  auVar143._12_4_ = uVar74;
                  auVar143._16_4_ = uVar74;
                  auVar143._20_4_ = uVar74;
                  auVar143._24_4_ = uVar74;
                  auVar143._28_4_ = uVar74;
                  auVar143._32_4_ = uVar74;
                  auVar143._36_4_ = uVar74;
                  auVar143._40_4_ = uVar74;
                  auVar143._44_4_ = uVar74;
                  auVar143._48_4_ = uVar74;
                  auVar143._52_4_ = uVar74;
                  auVar143._56_4_ = uVar74;
                  auVar143._60_4_ = uVar74;
                  auVar143 = vfmadd213ps_avx512f(auVar142,auVar135,auVar143);
                  auVar143 = vmaxps_avx512f(auVar143,auVar181);
                  auVar143 = vminps_avx512f(auVar143,auVar133);
                  auVar135 = vmulps_avx512f(auVar143,auVar135);
                }
                *pauVar78 = auVar135;
                pauVar78 = pauVar78 + 1;
                iVar58 = iVar58 + 1;
                local_2b8 = local_2b8 + 1;
              } while (iVar58 != _w);
            }
            iVar62 = iVar62 + 1;
          } while (iVar62 != _h);
        }
        local_2d8 = local_2d8 + 1;
      } while (local_2d8 != uVar70);
    }
LAB_004621b9:
    pMVar55 = local_118;
    DeconvolutionDepthWise::cut_padding
              ((DeconvolutionDepthWise *)
               ((long)&this->_vptr_DeconvolutionDepthWise_x86_avx512 +
               (long)this->_vptr_DeconvolutionDepthWise_x86_avx512[-3]),&local_248,local_118,opt);
    if ((pMVar55->data != (void *)0x0) && (iVar57 = 0, (long)pMVar55->c * pMVar55->cstep != 0))
    goto LAB_0046224c;
  }
  else {
    uVar12 = (long)iVar56 / (long)iVar57;
    uVar5 = (long)*(int *)(&this->field_0xd0 + (long)p_Var65) / (long)iVar57;
    local_2a8 = 1;
    uVar69 = 1;
    if (opt->use_packing_layout == true) {
      uVar69 = 0x10;
      local_2a8 = 0x10;
      if ((uVar12 & 0xf) != 0) {
        if ((uVar12 & 7) == 0) {
          local_2a8 = 8;
        }
        else {
          local_2a8 = (uint)((uVar12 & 3) == 0) * 3 + 1;
        }
      }
      if ((uVar5 & 0xf) != 0) {
        if ((uVar5 & 7) == 0) {
          uVar69 = 8;
        }
        else {
          uVar69 = (uint)((uVar5 & 3) == 0) * 3 + 1;
        }
      }
    }
    piVar13 = bottom_blob->refcount;
    local_178.data = bottom_blob->data;
    local_178.refcount = bottom_blob->refcount;
    local_178.elemsize = bottom_blob->elemsize;
    local_178.elempack = bottom_blob->elempack;
    local_178.allocator = bottom_blob->allocator;
    local_178.dims = bottom_blob->dims;
    local_178.w = bottom_blob->w;
    local_178.h = bottom_blob->h;
    local_178.d = bottom_blob->d;
    local_178.c = bottom_blob->c;
    local_178.cstep = bottom_blob->cstep;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    if (local_2a8 < iVar75) {
      auVar145 = vmovdqu64_avx512f((undefined1  [64])*opt);
      auVar145 = vmovdqu64_avx512f(auVar145);
      stack0xfffffffffffffe28 = auVar145._16_48_;
      local_1e8._0_8_ = auVar145._0_8_;
      local_1e8._8_8_ = opt->workspace_allocator;
      convert_packing(bottom_blob,&local_178,local_2a8,(Option *)local_1e8);
    }
    auVar53 = stack0xfffffffffffffe28;
    piVar13 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
    local_1e8._12_4_ = local_248.refcount._4_4_;
    local_1e8._8_4_ = local_248.refcount._0_4_;
    local_1e8._0_8_ = local_248.data;
    local_1e8._16_8_ = local_248.elemsize;
    auStack_1cc = auVar53._12_36_;
    iStack_1d0 = local_248.elempack;
    pAStack_1c8 = local_248.allocator;
    uStack_1c0._4_1_ = (bool)(undefined1)local_248.w;
    uStack_1c0._5_1_ = (bool)local_248.w._1_1_;
    uStack_1c0._6_1_ = (bool)local_248.w._2_1_;
    uStack_1c0._7_1_ = (bool)local_248.w._3_1_;
    uStack_1c0._0_1_ = (bool)(undefined1)local_248.dims;
    uStack_1c0._1_1_ = (bool)local_248.dims._1_1_;
    uStack_1c0._2_1_ = (bool)local_248.dims._2_1_;
    uStack_1c0._3_1_ = (bool)local_248.dims._3_1_;
    _iStack_1b8 = local_248._48_8_;
    auStack_1cc._32_4_ = auVar53._44_4_;
    iStack_1b0._0_1_ = (bool)(undefined1)local_248.c;
    iStack_1b0._1_1_ = (bool)local_248.c._1_1_;
    iStack_1b0._2_1_ = (bool)local_248.c._2_1_;
    iStack_1b0._3_1_ = (bool)local_248.c._3_1_;
    local_1a8 = local_248.cstep;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    pp_Var66 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
    if (uVar74 <= uVar69) {
LAB_00461d87:
      if (0 < *(int *)(&this->field_0x114 + (long)pp_Var66[-3])) {
        iVar62 = 0;
        iVar75 = 0;
        lVar71 = 0;
        do {
          OVar52 = _local_1e8;
          local_c0 = (void *)((long)(iVar62 / local_2a8) * local_178.cstep * local_178.elemsize +
                             (long)local_178.data);
          local_b8 = (int *)0x0;
          local_b0 = local_178.elemsize;
          local_a8 = local_178.elempack;
          local_a0 = local_178.allocator;
          local_80 = ((long)local_178.d * local_178.elemsize * (long)local_178.h * (long)local_178.w
                      + 0xf & 0xfffffffffffffff0) / local_178.elemsize;
          local_98 = local_178.dims;
          iStack_94 = local_178.w;
          iStack_90 = local_178.h;
          iStack_8c = local_178.d;
          local_108 = (void *)((long)(iVar75 / (int)uVar69) * local_1a8 * local_1e8._16_8_ +
                              local_1e8._0_8_);
          local_100 = (int *)0x0;
          local_f8 = (Allocator *)local_1e8._16_8_;
          local_f0 = iStack_1d0;
          local_e8 = pAStack_1c8;
          uVar20 = uStack_1c0;
          uVar54 = _iStack_1b8;
          local_c8 = ((long)iStack_1b4 * local_1e8._16_8_ *
                      (long)iStack_1b8 * (long)uStack_1c0._4_4_ + 0xfU & 0xfffffffffffffff0) /
                     (ulong)local_1e8._16_8_;
          uStack_1c0._0_4_ = (int)uVar20;
          uStack_1c0._4_4_ = SUB84(uVar20,4);
          local_e0 = (int)uStack_1c0;
          iStack_dc = uStack_1c0._4_4_;
          iStack_1b8 = (int)uVar54;
          iStack_1b4 = SUB84(uVar54,4);
          iStack_d8 = iStack_1b8;
          iStack_d4 = iStack_1b4;
          pLVar17 = (this->group_ops).
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar71];
          auVar145 = vmovdqu64_avx512f((undefined1  [64])*opt);
          auVar145 = vmovdqu64_avx512f(auVar145);
          auStack_68 = auVar145._16_48_;
          local_78 = auVar145._0_8_;
          pAStack_70 = pAStack_1c8;
          _local_1e8 = OVar52;
          local_d0 = (int)uVar5 / (int)uVar69;
          local_88 = (int)uVar12 / local_2a8;
          (*pLVar17->_vptr_Layer[7])(pLVar17,&local_c0,&local_108,&local_78);
          if (local_100 != (int *)0x0) {
            LOCK();
            *local_100 = *local_100 + -1;
            UNLOCK();
            if (*local_100 == 0) {
              if (local_e8 == (Allocator *)0x0) {
                if (local_108 != (void *)0x0) {
                  free(local_108);
                }
              }
              else {
                (*local_e8->_vptr_Allocator[3])();
              }
            }
          }
          if (local_b8 != (int *)0x0) {
            LOCK();
            *local_b8 = *local_b8 + -1;
            UNLOCK();
            if (*local_b8 == 0) {
              if (local_a0 == (Allocator *)0x0) {
                if (local_c0 != (void *)0x0) {
                  free(local_c0);
                }
              }
              else {
                (*local_a0->_vptr_Allocator[3])();
              }
            }
          }
          lVar71 = lVar71 + 1;
          iVar75 = iVar75 + (int)uVar5;
          iVar62 = iVar62 + (int)uVar12;
        } while (lVar71 < *(int *)(&this->field_0x114 +
                                  (long)this->_vptr_DeconvolutionDepthWise_x86_avx512[-3]));
      }
      if (uVar69 < uVar74) {
        convert_packing((Mat *)local_1e8,&local_248,uVar74,opt);
        pAVar67 = (Allocator *)local_1e8._8_8_;
      }
      else {
        if ((Allocator *)local_1e8._8_8_ != (Allocator *)0x0) {
          LOCK();
          *(int *)(_func_int ***)local_1e8._8_8_ = *(int *)(_func_int ***)local_1e8._8_8_ + 1;
          UNLOCK();
        }
        piVar13 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_248.allocator == (Allocator *)0x0) {
              if (local_248.data != (void *)0x0) {
                free(local_248.data);
              }
            }
            else {
              (*(local_248.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        OVar52 = _local_1e8;
        local_248.data = (void *)local_1e8._0_8_;
        local_248.refcount._0_4_ = local_1e8._8_4_;
        local_248.refcount._4_4_ = local_1e8._12_4_;
        local_248.elemsize = local_1e8._16_8_;
        local_248.elempack = iStack_1d0;
        local_248.allocator = pAStack_1c8;
        local_248.dims = local_1e8._40_4_;
        local_248.w = local_1e8._44_4_;
        local_248.h = iStack_1b8;
        local_248.d = iStack_1b4;
        iStack_1b0 = OVar52._56_4_;
        local_248.c = iStack_1b0;
        local_248.cstep = local_1a8;
        pAVar67 = (Allocator *)local_1e8._8_8_;
        _local_1e8 = OVar52;
      }
      if (pAVar67 != (Allocator *)0x0) {
        LOCK();
        *(int *)&pAVar67->_vptr_Allocator = *(int *)&pAVar67->_vptr_Allocator + -1;
        UNLOCK();
        if (*(int *)&pAVar67->_vptr_Allocator == 0) {
          if (pAStack_1c8 == (Allocator *)0x0) {
            if ((void *)local_1e8._0_8_ != (void *)0x0) {
              free((void *)local_1e8._0_8_);
            }
          }
          else {
            (*pAStack_1c8->_vptr_Allocator[3])();
          }
        }
      }
      if (local_178.refcount != (int *)0x0) {
        LOCK();
        *local_178.refcount = *local_178.refcount + -1;
        UNLOCK();
        if (*local_178.refcount == 0) {
          if (local_178.allocator == (Allocator *)0x0) {
            if (local_178.data != (void *)0x0) {
              free(local_178.data);
            }
          }
          else {
            (*(local_178.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_004621b9;
    }
    Mat::create((Mat *)local_1e8,_w,_h,
                *(int *)(&this->field_0xd0 + (long)pp_Var66[-3]) / (int)uVar69,
                (ulong)uVar69 * (sVar81 / uVar74),uVar69,opt->workspace_allocator);
    if (((void *)local_1e8._0_8_ != (void *)0x0) && ((long)iStack_1b0 * local_1a8 != 0)) {
      pp_Var66 = this->_vptr_DeconvolutionDepthWise_x86_avx512;
      goto LAB_00461d87;
    }
    if ((Allocator *)local_1e8._8_8_ != (Allocator *)0x0) {
      LOCK();
      *(int *)(_func_int ***)local_1e8._8_8_ = *(int *)(_func_int ***)local_1e8._8_8_ + -1;
      UNLOCK();
      if (*(int *)(_func_int ***)local_1e8._8_8_ == 0) {
        if (pAStack_1c8 == (Allocator *)0x0) {
          if ((void *)local_1e8._0_8_ != (void *)0x0) {
            free((void *)local_1e8._0_8_);
          }
        }
        else {
          (*pAStack_1c8->_vptr_Allocator[3])();
        }
      }
    }
    if (local_178.refcount != (int *)0x0) {
      LOCK();
      *local_178.refcount = *local_178.refcount + -1;
      UNLOCK();
      if (*local_178.refcount == 0) {
        if (local_178.allocator == (Allocator *)0x0) {
          if (local_178.data != (void *)0x0) {
            free(local_178.data);
          }
        }
        else {
          (*(local_178.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  iVar57 = -100;
LAB_0046224c:
  piVar13 = (int *)CONCAT44(local_248.refcount._4_4_,local_248.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_248.allocator == (Allocator *)0x0) {
        if (local_248.data != (void *)0x0) {
          free(local_248.data);
        }
      }
      else {
        (*(local_248.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar57;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 16;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m512 _sum = _mm512_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm512_loadu_ps((const float*)bias_data + g * 16);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 16;

                                    int k = y * kernel_w + x;

                                    __m512 _val = _mm512_loadu_ps(sptr);
                                    __m512 _w = _mm512_loadu_ps(kptr + k * 16);
                                    _sum = _mm512_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx512(_sum, activation_type, activation_params);

                            _mm512_storeu_ps(outptr, _sum);
                            outptr += 16;
                        }
                    }
                }
            }
        }
#endif // __AVX512F__

        if (elempack == 8)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m256 _sum = _mm256_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm256_loadu_ps((const float*)bias_data + g * 8);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 8;

                                    int k = y * kernel_w + x;

                                    __m256 _val = _mm256_loadu_ps(sptr);
                                    __m256 _w = _mm256_loadu_ps(kptr + k * 8);
                                    _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_avx(_sum, activation_type, activation_params);

                            _mm256_storeu_ps(outptr, _sum);
                            outptr += 8;
                        }
                    }
                }
            }
        }
#endif // __AVX__

        if (elempack == 4)
        {
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    float* outptr = top_blob_bordered.channel(g);
                    const float* kptr = (const float*)weight_data_tm + maxk * g * 4;
                    const Mat m = bottom_blob.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128 _sum = _mm_setzero_ps();

                            if (bias_term)
                            {
                                _sum = _mm_loadu_ps((const float*)bias_data + g * 4);
                            }

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    const float* sptr = m.row(sy) + sx * 4;

                                    int k = y * kernel_w + x;

                                    __m128 _val = _mm_loadu_ps(sptr);
                                    __m128 _w = _mm_loadu_ps(kptr + k * 4);
                                    _sum = _mm_comp_fmadd_ps(_val, _w, _sum);
                                }
                            }

                            _sum = activation_sse(_sum, activation_type, activation_params);

                            _mm_storeu_ps(outptr, _sum);
                            outptr += 4;
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g = 0; g < channels; g++)
            {
                float* outptr = top_blob_bordered.channel(g);
                const float* kptr = (const float*)weight_data_tm + maxk * g;
                const Mat m = bottom_blob.channel(g);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[g];
                        }

                        for (int y = 0; y < kernel_h; y++)
                        {
                            int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                            if (sys < 0 || sys % stride_h != 0)
                                continue;

                            int sy = sys / stride_h;
                            if (sy >= h)
                                continue;

                            const float* sptr = m.row(sy);

                            for (int x = 0; x < kernel_w; x++)
                            {
                                int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                if (sxs < 0 || sxs % stride_w != 0)
                                    continue;

                                int sx = sxs / stride_w;
                                if (sx >= w)
                                    continue;

                                float val = sptr[sx];

                                int k = y * kernel_w + x;

                                float w = kptr[k];

                                sum += val * w;
                            }
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[0] = sum;
                        outptr++;
                    }
                }
            }
        }
    }
    else
    {
        // group deconvolution
        const int channels_g = channels * elempack / group;
        const int num_output_g = num_output / group;

        int g_elempack = 1;
        int out_g_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            g_elempack = channels_g % 16 == 0 ? 16 : channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 16 == 0 ? 16 : num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#elif __AVX__
            g_elempack = channels_g % 8 == 0 ? 8 : channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 8 == 0 ? 8 : num_output_g % 4 == 0 ? 4 : 1;
#else
            g_elempack = channels_g % 4 == 0 ? 4 : 1;
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        // unpacking
        Mat bottom_blob_unpacked = bottom_blob;
        if (elempack > g_elempack)
        {
            Option opt_p = opt;
            opt_p.blob_allocator = opt.workspace_allocator;
            convert_packing(bottom_blob, bottom_blob_unpacked, g_elempack, opt_p);
        }

        Mat top_blob_bordered_unpacked = top_blob_bordered;
        if (out_g_elempack < out_elempack)
        {
            top_blob_bordered_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
            if (top_blob_bordered_unpacked.empty())
                return -100;
        }

        for (int g = 0; g < group; g++)
        {
            const Mat bottom_blob_g = bottom_blob_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
            Mat top_blob_bordered_g = top_blob_bordered_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.blob_allocator = top_blob_bordered_unpacked.allocator;

            // forward
            op->forward(bottom_blob_g, top_blob_bordered_g, opt_g);
        }

        // packing
        if (out_g_elempack < out_elempack)
        {
            convert_packing(top_blob_bordered_unpacked, top_blob_bordered, out_elempack, opt);
        }
        else
        {
            top_blob_bordered = top_blob_bordered_unpacked;
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}